

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_pack1to8.h
# Opt level: O3

void ncnn::conv3x3s1_pack1to8_avx(Mat *bottom_blob,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  float *pfVar1;
  float *pfVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  uint uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  undefined8 uVar42;
  undefined8 uVar43;
  undefined8 uVar44;
  undefined8 uVar45;
  undefined8 uVar46;
  undefined8 uVar47;
  undefined8 uVar48;
  undefined8 uVar49;
  undefined8 uVar50;
  undefined8 uVar51;
  undefined8 uVar52;
  undefined8 uVar53;
  undefined8 uVar54;
  undefined8 uVar55;
  undefined8 uVar56;
  undefined8 uVar57;
  undefined1 auVar58 [12];
  undefined1 auVar59 [28];
  undefined1 auVar60 [28];
  undefined1 auVar61 [28];
  undefined1 (*pauVar62) [32];
  undefined1 (*pauVar63) [32];
  int iVar64;
  int iVar65;
  void *pvVar66;
  uint uVar67;
  uint uVar68;
  undefined1 (*pauVar69) [32];
  void *pvVar70;
  ulong uVar71;
  ulong uVar72;
  undefined1 (*pauVar73) [32];
  float *pfVar74;
  undefined1 (*pauVar75) [32];
  undefined1 (*pauVar76) [32];
  undefined1 (*pauVar77) [32];
  long lVar78;
  undefined1 (*pauVar79) [32];
  long lVar80;
  void *pvVar81;
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  undefined1 in_ZMM1 [64];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  float fVar98;
  float fVar99;
  undefined1 auVar100 [32];
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  undefined1 auVar112 [64];
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar130;
  float fVar131;
  float fVar132;
  undefined1 auVar124 [32];
  float fVar127;
  float fVar128;
  float fVar129;
  undefined1 auVar125 [64];
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  float in_register_0000159c;
  float fVar140;
  ulong local_348;
  float local_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  float fStack_320;
  float local_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  float fStack_2c0;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  float fStack_264;
  float fStack_260;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  float fStack_240;
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  float fStack_220;
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  undefined8 *local_1b8;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float fStack_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  float fStack_e0;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  float fStack_c0;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  undefined1 auVar126 [64];
  
  uVar5 = bottom_blob->c;
  uVar6 = top_blob->w;
  iVar7 = top_blob->h;
  iVar8 = top_blob->c;
  uVar72 = (long)iVar8 & 0xfffffffffffffffe;
  if (0 < iVar8 >> 1) {
    uVar71 = 0;
    do {
      iVar64 = 1;
      if (top_blob->dims != 3) {
        iVar64 = top_blob->d;
      }
      lVar80 = uVar71 * 2 + 1;
      if (_bias == (Mat *)0x0) {
        in_ZMM1 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar82 = ZEXT1632(ZEXT816(0) << 0x40);
      }
      else {
        in_ZMM1 = ZEXT3264(*(undefined1 (*) [32])(&_bias->data + uVar71 * 8));
        auVar82 = *(undefined1 (*) [32])(&_bias->allocator + uVar71 * 8);
      }
      lVar78 = top_blob->elemsize * top_blob->cstep;
      pauVar75 = (undefined1 (*) [32])(lVar78 * uVar71 * 2 + (long)top_blob->data);
      iVar64 = iVar64 * top_blob->h * top_blob->w;
      pauVar79 = (undefined1 (*) [32])(lVar78 * lVar80 + (long)top_blob->data);
      pauVar69 = pauVar75;
      iVar65 = iVar64;
      if (0 < iVar64) {
        do {
          *pauVar69 = in_ZMM1._0_32_;
          iVar65 = iVar65 + -1;
          pauVar69 = pauVar69 + 1;
        } while (iVar65 != 0);
        pauVar69 = pauVar79;
        if (0 < iVar64) {
          do {
            *pauVar69 = auVar82;
            iVar64 = iVar64 + -1;
            pauVar69 = pauVar69 + 1;
          } while (iVar64 != 0);
        }
      }
      if (0 < (int)uVar5) {
        pfVar74 = (float *)(lVar80 * kernel->cstep * kernel->elemsize + (long)kernel->data);
        local_1b8 = (undefined8 *)
                    (uVar71 * 2 * kernel->cstep * kernel->elemsize + (long)kernel->data);
        local_348 = 0;
        do {
          if (0 < iVar7) {
            uVar42 = *local_1b8;
            uVar43 = local_1b8[1];
            uVar44 = local_1b8[2];
            uVar45 = local_1b8[3];
            uVar46 = local_1b8[4];
            uVar47 = local_1b8[5];
            uVar48 = local_1b8[6];
            uVar49 = local_1b8[7];
            uVar50 = *(undefined8 *)*(undefined1 (*) [12])(local_1b8 + 8);
            auVar58 = *(undefined1 (*) [12])(local_1b8 + 8);
            local_b8 = (float)uVar50;
            fStack_b4 = (float)((ulong)uVar50 >> 0x20);
            fStack_b0 = (float)local_1b8[9];
            fStack_ac = (float)((ulong)local_1b8[9] >> 0x20);
            fStack_a8 = (float)local_1b8[10];
            fStack_a4 = (float)((ulong)local_1b8[10] >> 0x20);
            fStack_a0 = (float)local_1b8[0xb];
            fStack_9c = (float)((ulong)local_1b8[0xb] >> 0x20);
            auVar82 = *(undefined1 (*) [32])(local_1b8 + 0xc);
            auVar3 = *(undefined1 (*) [32])(local_1b8 + 0x10);
            auVar4 = *(undefined1 (*) [32])(local_1b8 + 0x14);
            fVar87 = *(float *)(local_1b8 + 0x18);
            fVar102 = *(float *)((long)local_1b8 + 0xc4);
            fVar86 = *(float *)(local_1b8 + 0x19);
            fVar89 = *(float *)((long)local_1b8 + 0xcc);
            fVar9 = *(float *)(local_1b8 + 0x1a);
            fVar10 = *(float *)((long)local_1b8 + 0xd4);
            fVar11 = *(float *)(local_1b8 + 0x1b);
            fVar12 = *(float *)(local_1b8 + 0x1c);
            fVar13 = *(float *)((long)local_1b8 + 0xe4);
            fVar14 = *(float *)(local_1b8 + 0x1d);
            fVar15 = *(float *)((long)local_1b8 + 0xec);
            fVar16 = *(float *)(local_1b8 + 0x1e);
            fVar17 = *(float *)((long)local_1b8 + 0xf4);
            fVar18 = *(float *)(local_1b8 + 0x1f);
            fVar19 = *(float *)(local_1b8 + 0x20);
            fVar20 = *(float *)((long)local_1b8 + 0x104);
            fVar21 = *(float *)(local_1b8 + 0x21);
            fVar22 = *(float *)((long)local_1b8 + 0x10c);
            fVar23 = *(float *)(local_1b8 + 0x22);
            fVar24 = *(float *)((long)local_1b8 + 0x114);
            fVar25 = *(float *)(local_1b8 + 0x23);
            fVar109 = *(float *)((long)local_1b8 + 0x11c);
            fVar93 = *pfVar74;
            fVar35 = pfVar74[1];
            fVar116 = pfVar74[2];
            fVar36 = pfVar74[3];
            fVar118 = pfVar74[4];
            fVar37 = pfVar74[5];
            fVar38 = pfVar74[6];
            in_register_0000159c = pfVar74[7];
            fVar88 = pfVar74[8];
            fVar94 = pfVar74[9];
            fVar140 = pfVar74[10];
            fVar115 = pfVar74[0xb];
            fVar90 = pfVar74[0xc];
            fVar92 = pfVar74[0xd];
            fVar26 = pfVar74[0xe];
            fVar111 = pfVar74[0xf];
            auVar59 = *(undefined1 (*) [28])*(undefined1 (*) [32])(pfVar74 + 0x10);
            fVar34 = pfVar74[0x17];
            auVar85 = *(undefined1 (*) [32])(pfVar74 + 0x10);
            auVar83 = *(undefined1 (*) [32])(pfVar74 + 0x18);
            auVar112 = ZEXT3264(auVar83);
            fVar134 = *(float *)*(undefined1 (*) [28])(pfVar74 + 0x20);
            fVar39 = pfVar74[0x21];
            fVar91 = pfVar74[0x22];
            fVar40 = pfVar74[0x23];
            fVar98 = pfVar74[0x24];
            fVar41 = pfVar74[0x25];
            fVar101 = pfVar74[0x26];
            auVar60 = *(undefined1 (*) [28])(pfVar74 + 0x20);
            uVar50 = *(undefined8 *)(pfVar74 + 0x28);
            uVar51 = *(undefined8 *)(pfVar74 + 0x2a);
            uVar52 = *(undefined8 *)(pfVar74 + 0x2c);
            uVar53 = *(undefined8 *)(pfVar74 + 0x2e);
            auVar84 = *(undefined1 (*) [32])(pfVar74 + 0x30);
            auVar125 = ZEXT3264(auVar84);
            pvVar66 = (void *)(bottom_blob->cstep * local_348 * bottom_blob->elemsize +
                              (long)bottom_blob->data);
            lVar80 = (long)bottom_blob->w * bottom_blob->elemsize;
            pvVar70 = (void *)((long)pvVar66 + lVar80 * 2);
            pvVar81 = (void *)(lVar80 + (long)pvVar66);
            iVar64 = 0;
            uVar54 = *(undefined8 *)(pfVar74 + 0x38);
            uVar55 = *(undefined8 *)(pfVar74 + 0x3a);
            uVar56 = *(undefined8 *)(pfVar74 + 0x3c);
            uVar57 = *(undefined8 *)(pfVar74 + 0x3e);
            fVar27 = pfVar74[0x40];
            fVar28 = pfVar74[0x41];
            fVar29 = pfVar74[0x42];
            fVar30 = pfVar74[0x43];
            fVar31 = pfVar74[0x44];
            fVar32 = pfVar74[0x45];
            fVar33 = pfVar74[0x46];
            fVar138 = pfVar74[0x47];
            pauVar69 = pauVar75;
            pauVar73 = pauVar79;
            fVar136 = fVar34;
            do {
              local_2b8 = (float)uVar42;
              fStack_2b0 = (float)uVar43;
              fStack_2a8 = (float)uVar44;
              local_d8 = (float)uVar46;
              fStack_d4 = (float)((ulong)uVar46 >> 0x20);
              fStack_d0 = (float)uVar47;
              fStack_cc = (float)((ulong)uVar47 >> 0x20);
              fStack_c8 = (float)uVar48;
              fStack_c4 = (float)((ulong)uVar48 >> 0x20);
              fStack_c0 = (float)uVar49;
              local_258 = auVar82._0_4_;
              fStack_250 = auVar82._8_4_;
              fStack_24c = auVar82._12_4_;
              fStack_248 = auVar82._16_4_;
              fStack_244 = auVar82._20_4_;
              fStack_240 = auVar82._24_4_;
              local_238 = auVar3._0_4_;
              fStack_234 = auVar3._4_4_;
              fStack_230 = auVar3._8_4_;
              fStack_22c = auVar3._12_4_;
              fStack_228 = auVar3._16_4_;
              fStack_224 = auVar3._20_4_;
              fStack_220 = auVar3._24_4_;
              fStack_274 = auVar4._4_4_;
              fStack_270 = auVar4._8_4_;
              fStack_26c = auVar4._12_4_;
              fStack_268 = auVar4._16_4_;
              fStack_264 = auVar4._20_4_;
              fStack_260 = auVar4._24_4_;
              local_218 = auVar85._0_4_;
              fVar122 = local_218;
              fStack_214 = auVar85._4_4_;
              fStack_210 = auVar85._8_4_;
              fStack_20c = auVar85._12_4_;
              fStack_208 = auVar85._16_4_;
              fStack_204 = auVar85._20_4_;
              fStack_200 = auVar85._24_4_;
              local_188 = auVar83._0_4_;
              fStack_184 = auVar83._4_4_;
              fStack_180 = auVar83._8_4_;
              fStack_17c = auVar83._12_4_;
              fStack_178 = auVar83._16_4_;
              fStack_174 = auVar83._20_4_;
              fStack_170 = auVar83._24_4_;
              local_338 = (float)uVar50;
              fStack_330 = (float)uVar51;
              fStack_328 = (float)uVar52;
              local_f8 = auVar84._0_4_;
              fStack_f4 = auVar84._4_4_;
              fStack_f0 = auVar84._8_4_;
              fStack_ec = auVar84._12_4_;
              fStack_e8 = auVar84._16_4_;
              fStack_e4 = auVar84._20_4_;
              fStack_e0 = auVar84._24_4_;
              local_2d8 = (float)uVar54;
              fStack_2d0 = (float)uVar55;
              fStack_2c8 = (float)uVar56;
              fStack_2a0 = (float)uVar45;
              fStack_320 = (float)uVar53;
              fStack_2c0 = (float)uVar57;
              fStack_2b4 = (float)((ulong)uVar42 >> 0x20);
              fStack_2ac = (float)((ulong)uVar43 >> 0x20);
              fStack_2a4 = (float)((ulong)uVar44 >> 0x20);
              fStack_254 = auVar82._4_4_;
              fStack_334 = (float)((ulong)uVar50 >> 0x20);
              fStack_32c = (float)((ulong)uVar51 >> 0x20);
              fStack_324 = (float)((ulong)uVar52 >> 0x20);
              fStack_2d4 = (float)((ulong)uVar54 >> 0x20);
              fStack_2cc = (float)((ulong)uVar55 >> 0x20);
              fStack_2c4 = (float)((ulong)uVar56 >> 0x20);
              local_278 = auVar4._0_4_;
              if ((int)uVar6 < 4) {
                uVar68 = 0;
              }
              else {
                iVar65 = 3;
                lVar80 = 0;
                pauVar63 = pauVar69;
                pauVar62 = pauVar73;
                do {
                  pauVar77 = pauVar62;
                  pauVar76 = pauVar63;
                  fVar106 = *(float *)((long)pvVar66 + lVar80);
                  fVar107 = *(float *)((long)pvVar66 + lVar80 + 4);
                  fVar99 = *(float *)((long)pvVar66 + lVar80 + 8);
                  fVar104 = *(float *)((long)pvVar81 + lVar80);
                  fVar117 = *(float *)((long)pvVar81 + lVar80 + 4);
                  pfVar2 = (float *)((long)*pauVar69 + lVar80 * 2 * 4);
                  fVar103 = *(float *)((long)pvVar81 + lVar80 + 8);
                  fVar133 = *(float *)((long)pvVar70 + lVar80);
                  pfVar1 = (float *)((long)*pauVar73 + lVar80 * 2 * 4);
                  fVar135 = *(float *)((long)pvVar70 + lVar80 + 4);
                  fVar110 = fVar136 + fVar111 + pfVar2[7];
                  fVar130 = auVar125._28_4_ + fVar138 + fVar138 + fVar138 + fVar110;
                  local_218 = auVar59._0_4_;
                  fVar139 = fVar136 + fVar110;
                  fVar111 = *(float *)((long)pvVar70 + lVar80 + 8);
                  fVar138 = *pfVar1;
                  fVar105 = pfVar1[1];
                  fVar123 = pfVar1[2];
                  fVar127 = pfVar1[3];
                  fVar128 = pfVar1[4];
                  fVar129 = pfVar1[5];
                  fVar113 = pfVar1[6];
                  fVar108 = fVar139 + fVar106 + pfVar1[7];
                  fVar136 = fVar136 + fVar110 + fVar139;
                  fVar110 = fVar139 + fVar104 + fVar139 + fVar108;
                  fVar119 = fVar136 + fVar130;
                  fVar108 = fVar130 + fVar108 + fVar133 + fVar110;
                  *pfVar2 = fVar133 * fVar87 + fVar117 * local_238 + fVar106 * local_2b8 + *pfVar2 +
                            fVar111 * fVar19 +
                            fVar107 * local_d8 + fVar99 * local_b8 + fVar104 * local_258 +
                            fVar103 * local_278 + fVar135 * fVar12;
                  pfVar2[1] = fVar133 * fVar102 +
                              fVar117 * fStack_234 + fVar106 * fStack_2b4 + pfVar2[1] +
                              fVar111 * fVar20 +
                              fVar107 * fStack_d4 + fVar99 * fStack_b4 + fVar104 * fStack_254 +
                              fVar103 * fStack_274 + fVar135 * fVar13;
                  pfVar2[2] = fVar133 * fVar86 +
                              fVar117 * fStack_230 + fVar106 * fStack_2b0 + pfVar2[2] +
                              fVar111 * fVar21 +
                              fVar107 * fStack_d0 + fVar99 * fStack_b0 + fVar104 * fStack_250 +
                              fVar103 * fStack_270 + fVar135 * fVar14;
                  pfVar2[3] = fVar133 * fVar89 +
                              fVar117 * fStack_22c + fVar106 * fStack_2ac + pfVar2[3] +
                              fVar111 * fVar22 +
                              fVar107 * fStack_cc + fVar99 * fStack_ac + fVar104 * fStack_24c +
                              fVar103 * fStack_26c + fVar135 * fVar15;
                  pfVar2[4] = fVar133 * fVar9 +
                              fVar117 * fStack_228 + fVar106 * fStack_2a8 + pfVar2[4] +
                              fVar111 * fVar23 +
                              fVar107 * fStack_c8 + fVar99 * fStack_a8 + fVar104 * fStack_248 +
                              fVar103 * fStack_268 + fVar135 * fVar16;
                  pfVar2[5] = fVar133 * fVar10 +
                              fVar117 * fStack_224 + fVar106 * fStack_2a4 + pfVar2[5] +
                              fVar111 * fVar24 +
                              fVar107 * fStack_c4 + fVar99 * fStack_a4 + fVar104 * fStack_244 +
                              fVar103 * fStack_264 + fVar135 * fVar17;
                  pfVar2[6] = fVar133 * fVar11 +
                              fVar117 * fStack_220 + fVar106 * fStack_2a0 + pfVar2[6] +
                              fVar111 * fVar25 +
                              fVar107 * fStack_c0 + fVar99 * fStack_a0 + fVar104 * fStack_240 +
                              fVar103 * fStack_260 + fVar135 * fVar18;
                  pfVar2[7] = fVar119;
                  *pfVar1 = fVar111 * fVar27 +
                            fVar117 * fVar134 + fVar106 * fVar93 + fVar138 + fVar133 * local_f8 +
                            fVar107 * fVar88 + fVar99 * local_218 + fVar104 * local_188 +
                            fVar103 * local_338 + fVar135 * local_2d8;
                  pfVar1[1] = fVar111 * fVar28 +
                              fVar117 * fVar39 + fVar106 * fVar35 + fVar105 + fVar133 * fStack_f4 +
                              fVar107 * fVar94 + fVar99 * fStack_214 + fVar104 * fStack_184 +
                              fVar103 * fStack_334 + fVar135 * fStack_2d4;
                  pfVar1[2] = fVar111 * fVar29 +
                              fVar117 * fVar91 + fVar106 * fVar116 + fVar123 + fVar133 * fStack_f0 +
                              fVar107 * fVar140 + fVar99 * fStack_210 + fVar104 * fStack_180 +
                              fVar103 * fStack_330 + fVar135 * fStack_2d0;
                  pfVar1[3] = fVar111 * fVar30 +
                              fVar117 * fVar40 + fVar106 * fVar36 + fVar127 + fVar133 * fStack_ec +
                              fVar107 * fVar115 + fVar99 * fStack_20c + fVar104 * fStack_17c +
                              fVar103 * fStack_32c + fVar135 * fStack_2cc;
                  pfVar1[4] = fVar111 * fVar31 +
                              fVar117 * fVar98 + fVar106 * fVar118 + fVar128 + fVar133 * fStack_e8 +
                              fVar107 * fVar90 + fVar99 * fStack_208 + fVar104 * fStack_178 +
                              fVar103 * fStack_328 + fVar135 * fStack_2c8;
                  pfVar1[5] = fVar111 * fVar32 +
                              fVar117 * fVar41 + fVar106 * fVar37 + fVar129 + fVar133 * fStack_e4 +
                              fVar107 * fVar92 + fVar99 * fStack_204 + fVar104 * fStack_174 +
                              fVar103 * fStack_324 + fVar135 * fStack_2c4;
                  pfVar1[6] = fVar111 * fVar33 +
                              fVar117 * fVar101 + fVar106 * fVar38 + fVar113 + fVar133 * fStack_e0 +
                              fVar107 * fVar26 + fVar99 * fStack_200 + fVar104 * fStack_170 +
                              fVar103 * fStack_320 + fVar135 * fStack_2c0;
                  pfVar1[7] = fVar108;
                  fVar119 = fVar119 + fVar110;
                  fVar106 = *(float *)((long)pvVar66 + lVar80 + 0xc);
                  fVar104 = *(float *)((long)pvVar81 + lVar80 + 0xc);
                  fVar136 = fVar136 + fVar107;
                  fVar133 = *(float *)((long)pvVar70 + lVar80 + 0xc);
                  fStack_16c = auVar83._28_4_;
                  fVar113 = fVar136 + fVar117 + fVar139;
                  fVar131 = fVar130 + fVar139 + fVar139 + fVar139;
                  fVar130 = fVar136 + fVar139 + fVar113;
                  fVar136 = pfVar1[8];
                  fVar138 = pfVar1[9];
                  fVar105 = pfVar1[10];
                  fVar123 = pfVar1[0xb];
                  fVar127 = pfVar1[0xc];
                  fVar128 = pfVar1[0xd];
                  fVar129 = pfVar1[0xe];
                  fVar108 = fVar110 + fVar108 + fVar119 + fVar119 + pfVar2[0xf] + fVar131;
                  fVar113 = fVar113 + fVar106 + fVar139 + pfVar1[0xf] + fVar130;
                  pfVar2[8] = fVar99 * local_d8 + fVar107 * local_2b8 +
                              local_238 * fVar103 + fVar117 * local_258 + fVar135 * fVar87 +
                              pfVar2[8] +
                              fVar12 * fVar111 + fVar106 * local_b8 + fVar104 * local_278 +
                              fVar133 * fVar19;
                  pfVar2[9] = fVar99 * fStack_d4 + fVar107 * fStack_2b4 +
                              fStack_234 * fVar103 + fVar117 * fStack_254 + fVar135 * fVar102 +
                              pfVar2[9] +
                              fVar13 * fVar111 + fVar106 * fStack_b4 + fVar104 * fStack_274 +
                              fVar133 * fVar20;
                  pfVar2[10] = fVar99 * fStack_d0 + fVar107 * fStack_2b0 +
                               fStack_230 * fVar103 + fVar117 * fStack_250 + fVar135 * fVar86 +
                               pfVar2[10] +
                               fVar14 * fVar111 + fVar106 * fStack_b0 + fVar104 * fStack_270 +
                               fVar133 * fVar21;
                  pfVar2[0xb] = fVar99 * fStack_cc + fVar107 * fStack_2ac +
                                fStack_22c * fVar103 + fVar117 * fStack_24c + fVar135 * fVar89 +
                                pfVar2[0xb] +
                                fVar15 * fVar111 + fVar106 * fStack_ac + fVar104 * fStack_26c +
                                fVar133 * fVar22;
                  pfVar2[0xc] = fVar99 * fStack_c8 + fVar107 * fStack_2a8 +
                                fStack_228 * fVar103 + fVar117 * fStack_248 + fVar135 * fVar9 +
                                pfVar2[0xc] +
                                fVar16 * fVar111 + fVar106 * fStack_a8 + fVar104 * fStack_268 +
                                fVar133 * fVar23;
                  pfVar2[0xd] = fVar99 * fStack_c4 + fVar107 * fStack_2a4 +
                                fStack_224 * fVar103 + fVar117 * fStack_244 + fVar135 * fVar10 +
                                pfVar2[0xd] +
                                fVar17 * fVar111 + fVar106 * fStack_a4 + fVar104 * fStack_264 +
                                fVar133 * fVar24;
                  pfVar2[0xe] = fVar99 * fStack_c0 + fVar107 * fStack_2a0 +
                                fStack_220 * fVar103 + fVar117 * fStack_240 + fVar135 * fVar11 +
                                pfVar2[0xe] +
                                fVar18 * fVar111 + fVar106 * fStack_a0 + fVar104 * fStack_260 +
                                fVar133 * fVar25;
                  pfVar2[0xf] = fVar108;
                  pfVar1[8] = fVar99 * fVar88 + fVar107 * fVar93 +
                              fVar117 * local_188 + fVar103 * fVar134 +
                              fVar135 * local_f8 + fVar111 * local_2d8 + fVar136 +
                              fVar106 * local_218 + fVar104 * local_338 + fVar133 * fVar27;
                  pfVar1[9] = fVar99 * fVar94 + fVar107 * fVar35 +
                              fVar117 * fStack_184 + fVar103 * fVar39 +
                              fVar135 * fStack_f4 + fVar111 * fStack_2d4 + fVar138 +
                              fVar106 * fStack_214 + fVar104 * fStack_334 + fVar133 * fVar28;
                  pfVar1[10] = fVar99 * fVar140 + fVar107 * fVar116 +
                               fVar117 * fStack_180 + fVar103 * fVar91 +
                               fVar135 * fStack_f0 + fVar111 * fStack_2d0 + fVar105 +
                               fVar106 * fStack_210 + fVar104 * fStack_330 + fVar133 * fVar29;
                  pfVar1[0xb] = fVar99 * fVar115 + fVar107 * fVar36 +
                                fVar117 * fStack_17c + fVar103 * fVar40 +
                                fVar135 * fStack_ec + fVar111 * fStack_2cc + fVar123 +
                                fVar106 * fStack_20c + fVar104 * fStack_32c + fVar133 * fVar30;
                  pfVar1[0xc] = fVar99 * fVar90 + fVar107 * fVar118 +
                                fVar117 * fStack_178 + fVar103 * fVar98 +
                                fVar135 * fStack_e8 + fVar111 * fStack_2c8 + fVar127 +
                                fVar106 * fStack_208 + fVar104 * fStack_328 + fVar133 * fVar31;
                  pfVar1[0xd] = fVar99 * fVar92 + fVar107 * fVar37 +
                                fVar117 * fStack_174 + fVar103 * fVar41 +
                                fVar135 * fStack_e4 + fVar111 * fStack_2c4 + fVar128 +
                                fVar106 * fStack_204 + fVar104 * fStack_324 + fVar133 * fVar32;
                  pfVar1[0xe] = fVar99 * fVar26 + fVar107 * fVar38 +
                                fVar117 * fStack_170 + fVar103 * fVar101 +
                                fVar135 * fStack_e0 + fVar111 * fStack_2c0 + fVar129 +
                                fVar106 * fStack_200 + fVar104 * fStack_320 + fVar133 * fVar33;
                  pfVar1[0xf] = fVar113;
                  fVar107 = *(float *)((long)pvVar66 + lVar80 + 0x10);
                  fVar117 = *(float *)((long)pvVar81 + lVar80 + 0x10);
                  fVar135 = *(float *)((long)pvVar70 + lVar80 + 0x10);
                  fVar137 = fVar99 + fVar106;
                  in_ZMM1 = ZEXT3264(auVar4);
                  fVar139 = fVar131 + fVar99 + fVar106 + fVar106;
                  fVar108 = fVar108 + fVar113 + fVar113 + fVar130 + fVar131 + pfVar2[0x17] + fVar139
                  ;
                  fVar136 = pfVar1[0x10];
                  fVar138 = pfVar1[0x11];
                  fVar105 = pfVar1[0x12];
                  fVar123 = pfVar1[0x13];
                  fVar127 = pfVar1[0x14];
                  fVar128 = pfVar1[0x15];
                  fVar129 = pfVar1[0x16];
                  fVar113 = pfVar1[0x17];
                  pfVar2[0x10] = fVar103 * local_258 + fVar99 * local_2b8 +
                                 fVar111 * fVar87 + fVar106 * local_d8 + fVar104 * local_238 +
                                 pfVar2[0x10] +
                                 fVar133 * fVar12 + fVar107 * local_b8 + fVar117 * local_278 +
                                 fVar135 * fVar19;
                  pfVar2[0x11] = fVar103 * fStack_254 + fVar99 * fStack_2b4 +
                                 fVar111 * fVar102 + fVar106 * fStack_d4 + fVar104 * fStack_234 +
                                 pfVar2[0x11] +
                                 fVar133 * fVar13 + fVar107 * fStack_b4 + fVar117 * fStack_274 +
                                 fVar135 * fVar20;
                  pfVar2[0x12] = fVar103 * fStack_250 + fVar99 * fStack_2b0 +
                                 fVar111 * fVar86 + fVar106 * fStack_d0 + fVar104 * fStack_230 +
                                 pfVar2[0x12] +
                                 fVar133 * fVar14 + fVar107 * fStack_b0 + fVar117 * fStack_270 +
                                 fVar135 * fVar21;
                  pfVar2[0x13] = fVar103 * fStack_24c + fVar99 * fStack_2ac +
                                 fVar111 * fVar89 + fVar106 * fStack_cc + fVar104 * fStack_22c +
                                 pfVar2[0x13] +
                                 fVar133 * fVar15 + fVar107 * fStack_ac + fVar117 * fStack_26c +
                                 fVar135 * fVar22;
                  pfVar2[0x14] = fVar103 * fStack_248 + fVar99 * fStack_2a8 +
                                 fVar111 * fVar9 + fVar106 * fStack_c8 + fVar104 * fStack_228 +
                                 pfVar2[0x14] +
                                 fVar133 * fVar16 + fVar107 * fStack_a8 + fVar117 * fStack_268 +
                                 fVar135 * fVar23;
                  pfVar2[0x15] = fVar103 * fStack_244 + fVar99 * fStack_2a4 +
                                 fVar111 * fVar10 + fVar106 * fStack_c4 + fVar104 * fStack_224 +
                                 pfVar2[0x15] +
                                 fVar133 * fVar17 + fVar107 * fStack_a4 + fVar117 * fStack_264 +
                                 fVar135 * fVar24;
                  pfVar2[0x16] = fVar103 * fStack_240 + fVar99 * fStack_2a0 +
                                 fVar111 * fVar11 + fVar106 * fStack_c0 + fVar104 * fStack_220 +
                                 pfVar2[0x16] +
                                 fVar133 * fVar18 + fVar107 * fStack_a0 + fVar117 * fStack_260 +
                                 fVar135 * fVar25;
                  pfVar2[0x17] = fVar108;
                  pfVar1[0x10] = fVar104 * auVar60._0_4_ + fVar133 * local_2d8 +
                                 fVar99 * fVar93 + fVar103 * local_188 +
                                 fVar106 * fVar88 + fVar111 * local_f8 + fVar136 +
                                 fVar135 * fVar27 + fVar107 * local_218 + fVar117 * local_338;
                  pfVar1[0x11] = fVar104 * auVar60._4_4_ + fVar133 * fStack_2d4 +
                                 fVar99 * fVar35 + fVar103 * fStack_184 +
                                 fVar106 * fVar94 + fVar111 * fStack_f4 + fVar138 +
                                 fVar135 * fVar28 + fVar107 * fStack_214 + fVar117 * fStack_334;
                  pfVar1[0x12] = fVar104 * auVar60._8_4_ + fVar133 * fStack_2d0 +
                                 fVar99 * fVar116 + fVar103 * fStack_180 +
                                 fVar106 * fVar140 + fVar111 * fStack_f0 + fVar105 +
                                 fVar135 * fVar29 + fVar107 * fStack_210 + fVar117 * fStack_330;
                  pfVar1[0x13] = fVar104 * auVar60._12_4_ + fVar133 * fStack_2cc +
                                 fVar99 * fVar36 + fVar103 * fStack_17c +
                                 fVar106 * fVar115 + fVar111 * fStack_ec + fVar123 +
                                 fVar135 * fVar30 + fVar107 * fStack_20c + fVar117 * fStack_32c;
                  pfVar1[0x14] = fVar104 * auVar60._16_4_ + fVar133 * fStack_2c8 +
                                 fVar99 * fVar118 + fVar103 * fStack_178 +
                                 fVar106 * fVar90 + fVar111 * fStack_e8 + fVar127 +
                                 fVar135 * fVar31 + fVar107 * fStack_208 + fVar117 * fStack_328;
                  pfVar1[0x15] = fVar104 * auVar60._20_4_ + fVar133 * fStack_2c4 +
                                 fVar99 * fVar37 + fVar103 * fStack_174 +
                                 fVar106 * fVar92 + fVar111 * fStack_e4 + fVar128 +
                                 fVar135 * fVar32 + fVar107 * fStack_204 + fVar117 * fStack_324;
                  pfVar1[0x16] = fVar104 * auVar60._24_4_ + fVar133 * fStack_2c0 +
                                 fVar99 * fVar38 + fVar103 * fStack_170 +
                                 fVar106 * fVar26 + fVar111 * fStack_e0 + fVar129 +
                                 fVar135 * fVar33 + fVar107 * fStack_200 + fVar117 * fStack_320;
                  pfVar1[0x17] = fVar137 + fVar99 + fStack_16c + fVar106 + fVar111 + fVar113 +
                                 fVar137 + fVar106 + fVar106 + fVar111;
                  fVar99 = *(float *)((long)pvVar66 + lVar80 + 0x14);
                  fVar111 = *(float *)((long)pvVar81 + lVar80 + 0x14);
                  fVar139 = fVar137 + fVar139;
                  fVar138 = fVar106 + fVar137;
                  fVar136 = *(float *)((long)pvVar70 + lVar80 + 0x14);
                  fVar123 = fVar99 * local_b8 + fVar111 * local_278 + fVar136 * fVar19;
                  fVar127 = fVar99 * fStack_b4 + fVar111 * fStack_274 + fVar136 * fVar20;
                  fVar128 = fVar99 * fStack_b0 + fVar111 * fStack_270 + fVar136 * fVar21;
                  fVar129 = fVar99 * fStack_ac + fVar111 * fStack_26c + fVar136 * fVar22;
                  fVar113 = fVar99 * fStack_a8 + fVar111 * fStack_268 + fVar136 * fVar23;
                  fVar110 = fVar99 * fStack_a4 + fVar111 * fStack_264 + fVar136 * fVar24;
                  fVar119 = fVar99 * fStack_a0 + fVar111 * fStack_260 + fVar136 * fVar25;
                  fVar130 = fVar137 + fVar139 + fVar138;
                  auVar125 = ZEXT3264(CONCAT428(fVar130,CONCAT424(fVar119,CONCAT420(fVar110,
                                                  CONCAT416(fVar113,CONCAT412(fVar129,CONCAT48(
                                                  fVar128,CONCAT44(fVar127,fVar123))))))));
                  fVar105 = fVar109 + fVar106;
                  fVar103 = fVar106 + fStack_9c + fVar105;
                  auVar95._0_4_ =
                       fVar104 * local_188 + fVar106 * fVar93 +
                       fVar133 * local_f8 + fVar107 * fVar88 +
                       fVar117 * auVar60._0_4_ + fVar135 * local_2d8 + fVar99 * fVar122 +
                       pfVar1[0x18] + fVar111 * local_338 + fVar136 * fVar27;
                  auVar95._4_4_ =
                       fVar104 * fStack_184 + fVar106 * fVar35 +
                       fVar133 * fStack_f4 + fVar107 * fVar94 +
                       fVar117 * auVar60._4_4_ + fVar135 * fStack_2d4 + fVar99 * fStack_214 +
                       pfVar1[0x19] + fVar111 * fStack_334 + fVar136 * fVar28;
                  auVar95._8_4_ =
                       fVar104 * fStack_180 + fVar106 * fVar116 +
                       fVar133 * fStack_f0 + fVar107 * fVar140 +
                       fVar117 * auVar60._8_4_ + fVar135 * fStack_2d0 + fVar99 * fStack_210 +
                       pfVar1[0x1a] + fVar111 * fStack_330 + fVar136 * fVar29;
                  auVar95._12_4_ =
                       fVar104 * fStack_17c + fVar106 * fVar36 +
                       fVar133 * fStack_ec + fVar107 * fVar115 +
                       fVar117 * auVar60._12_4_ + fVar135 * fStack_2cc + fVar99 * fStack_20c +
                       pfVar1[0x1b] + fVar111 * fStack_32c + fVar136 * fVar30;
                  auVar95._16_4_ =
                       fVar104 * fStack_178 + fVar106 * fVar118 +
                       fVar133 * fStack_e8 + fVar107 * fVar90 +
                       fVar117 * auVar60._16_4_ + fVar135 * fStack_2c8 + fVar99 * fStack_208 +
                       pfVar1[0x1c] + fVar111 * fStack_328 + fVar136 * fVar31;
                  auVar95._20_4_ =
                       fVar104 * fStack_174 + fVar106 * fVar37 +
                       fVar133 * fStack_e4 + fVar107 * fVar92 +
                       fVar117 * auVar60._20_4_ + fVar135 * fStack_2c4 + fVar99 * fStack_204 +
                       pfVar1[0x1d] + fVar111 * fStack_324 + fVar136 * fVar32;
                  auVar95._24_4_ =
                       fVar104 * fStack_170 + fVar106 * fVar38 +
                       fVar133 * fStack_e0 + fVar107 * fVar26 +
                       fVar117 * auVar60._24_4_ + fVar135 * fStack_2c0 + fVar99 * fStack_200 +
                       pfVar1[0x1e] + fVar111 * fStack_320 + fVar136 * fVar33;
                  auVar95._28_4_ =
                       fVar103 + fVar105 + fVar135 + fVar99 + pfVar1[0x1f] + fVar99 + fVar103;
                  pfVar2[0x18] = fVar123 + fVar104 * local_258 + fVar106 * local_2b8 +
                                           fVar133 * fVar87 + fVar107 * local_d8 +
                                           fVar117 * local_238 + fVar135 * fVar12 + pfVar2[0x18];
                  pfVar2[0x19] = fVar127 + fVar104 * fStack_254 + fVar106 * fStack_2b4 +
                                           fVar133 * fVar102 + fVar107 * fStack_d4 +
                                           fVar117 * fStack_234 + fVar135 * fVar13 + pfVar2[0x19];
                  pfVar2[0x1a] = fVar128 + fVar104 * fStack_250 + fVar106 * fStack_2b0 +
                                           fVar133 * fVar86 + fVar107 * fStack_d0 +
                                           fVar117 * fStack_230 + fVar135 * fVar14 + pfVar2[0x1a];
                  pfVar2[0x1b] = fVar129 + fVar104 * fStack_24c + fVar106 * fStack_2ac +
                                           fVar133 * fVar89 + fVar107 * fStack_cc +
                                           fVar117 * fStack_22c + fVar135 * fVar15 + pfVar2[0x1b];
                  pfVar2[0x1c] = fVar113 + fVar104 * fStack_248 + fVar106 * fStack_2a8 +
                                           fVar133 * fVar9 + fVar107 * fStack_c8 +
                                           fVar117 * fStack_228 + fVar135 * fVar16 + pfVar2[0x1c];
                  pfVar2[0x1d] = fVar110 + fVar104 * fStack_244 + fVar106 * fStack_2a4 +
                                           fVar133 * fVar10 + fVar107 * fStack_c4 +
                                           fVar117 * fStack_224 + fVar135 * fVar17 + pfVar2[0x1d];
                  pfVar2[0x1e] = fVar119 + fVar104 * fStack_240 + fVar106 * fStack_2a0 +
                                           fVar133 * fVar11 + fVar107 * fStack_c0 +
                                           fVar117 * fStack_220 + fVar135 * fVar18 + pfVar2[0x1e];
                  pfVar2[0x1f] = fVar130 + fVar137 + fVar108 + fVar139 + fVar138 + pfVar2[0x1f];
                  *(undefined1 (*) [32])(pfVar1 + 0x18) = auVar95;
                  lVar80 = lVar80 + 0x10;
                  iVar65 = iVar65 + 4;
                  pauVar63 = (undefined1 (*) [32])(pfVar2 + 0x20);
                  pauVar62 = (undefined1 (*) [32])(pfVar1 + 0x20);
                } while (iVar65 < (int)uVar6);
                pauVar69 = pauVar76 + 4;
                pauVar73 = pauVar77 + 4;
                pvVar66 = (void *)((long)pvVar66 + lVar80);
                pvVar81 = (void *)((long)pvVar81 + lVar80);
                pvVar70 = (void *)((long)pvVar70 + lVar80);
                auVar112 = ZEXT3264(auVar83);
                auVar125 = ZEXT3264(auVar84);
                uVar68 = uVar6 & 0xfffffffc;
              }
              if ((int)(uVar68 | 1) < (int)uVar6) {
                lVar80 = 0;
                pauVar62 = pauVar73;
                pauVar63 = pauVar69;
                uVar67 = uVar68;
                fVar106 = fVar138;
                do {
                  pauVar77 = pauVar63;
                  pauVar76 = pauVar62;
                  fVar107 = *(float *)((long)pvVar66 + lVar80);
                  fVar99 = *(float *)((long)pvVar66 + lVar80 + 4);
                  fVar111 = *(float *)((long)pvVar66 + lVar80 + 8);
                  fVar104 = *(float *)((long)pvVar81 + lVar80);
                  fVar117 = *(float *)((long)pvVar81 + lVar80 + 4);
                  fVar103 = *(float *)((long)pvVar81 + lVar80 + 8);
                  fVar133 = *(float *)((long)pvVar70 + lVar80);
                  fVar135 = *(float *)((long)pvVar70 + lVar80 + 4);
                  fVar138 = *(float *)((long)pvVar70 + lVar80 + 8);
                  fStack_29c = (float)((ulong)uVar45 >> 0x20);
                  pauVar63 = (undefined1 (*) [32])((long)pauVar69[2] + lVar80 * 2 * 4);
                  fVar105 = *(float *)((long)pauVar63[-2] + 4);
                  fVar123 = *(float *)((long)pauVar63[-2] + 8);
                  fVar127 = *(float *)((long)pauVar63[-2] + 0xc);
                  fVar128 = *(float *)((long)pauVar63[-2] + 0x10);
                  fVar129 = *(float *)((long)pauVar63[-2] + 0x14);
                  fVar113 = *(float *)((long)pauVar63[-2] + 0x18);
                  pauVar62 = (undefined1 (*) [32])((long)pauVar73[2] + lVar80 * 2 * 4);
                  fVar132 = auVar125._28_4_ + *(float *)((long)pauVar63[-2] + 0x1c) + fVar136 +
                            fVar136 + fVar136;
                  fVar108 = *(float *)pauVar62[-2];
                  fVar110 = *(float *)((long)pauVar62[-2] + 4);
                  fVar119 = *(float *)((long)pauVar62[-2] + 8);
                  fVar130 = *(float *)((long)pauVar62[-2] + 0xc);
                  fVar131 = *(float *)((long)pauVar62[-2] + 0x10);
                  fVar139 = *(float *)((long)pauVar62[-2] + 0x14);
                  fVar137 = *(float *)((long)pauVar62[-2] + 0x18);
                  in_ZMM1 = ZEXT3264(CONCAT428(fStack_9c,
                                               CONCAT424(fStack_a0,
                                                         CONCAT420(fStack_a4,
                                                                   CONCAT416(fStack_a8,
                                                                             CONCAT412(fStack_ac,
                                                                                       auVar58))))))
                  ;
                  fStack_29c = fVar136 + fStack_29c;
                  fVar120 = fVar107 + *(float *)((long)pauVar62[-2] + 0x1c) + fStack_29c;
                  fVar114 = fStack_29c + fVar104 + fStack_29c + fVar120;
                  fVar121 = fVar132 + fVar106 + fVar136 + fVar136 + fVar136 + fVar136;
                  fVar120 = fVar120 + fVar133 + fVar132 + fVar114;
                  *(float *)pauVar63[-2] =
                       fVar107 * local_2b8 + *(float *)pauVar63[-2] + fVar117 * local_238 +
                       fVar133 * fVar87 + fVar138 * fVar19 +
                       local_d8 * fVar99 + fVar111 * auVar58._0_4_ + fVar104 * local_258 +
                       fVar103 * local_278 + fVar135 * fVar12;
                  *(float *)((long)pauVar63[-2] + 4) =
                       fVar107 * fStack_2b4 + fVar105 + fVar117 * fStack_234 + fVar133 * fVar102 +
                       fVar138 * fVar20 +
                       fStack_d4 * fVar99 + fVar111 * auVar58._4_4_ + fVar104 * fStack_254 +
                       fVar103 * fStack_274 + fVar135 * fVar13;
                  *(float *)((long)pauVar63[-2] + 8) =
                       fVar107 * fStack_2b0 + fVar123 + fVar117 * fStack_230 + fVar133 * fVar86 +
                       fVar138 * fVar21 +
                       fStack_d0 * fVar99 + fVar111 * auVar58._8_4_ + fVar104 * fStack_250 +
                       fVar103 * fStack_270 + fVar135 * fVar14;
                  *(float *)((long)pauVar63[-2] + 0xc) =
                       fVar107 * fStack_2ac + fVar127 + fVar117 * fStack_22c + fVar133 * fVar89 +
                       fVar138 * fVar22 +
                       fStack_cc * fVar99 + fVar111 * fStack_ac + fVar104 * fStack_24c +
                       fVar103 * fStack_26c + fVar135 * fVar15;
                  *(float *)((long)pauVar63[-2] + 0x10) =
                       fVar107 * fStack_2a8 + fVar128 + fVar117 * fStack_228 + fVar133 * fVar9 +
                       fVar138 * fVar23 +
                       fStack_c8 * fVar99 + fVar111 * fStack_a8 + fVar104 * fStack_248 +
                       fVar103 * fStack_268 + fVar135 * fVar16;
                  *(float *)((long)pauVar63[-2] + 0x14) =
                       fVar107 * fStack_2a4 + fVar129 + fVar117 * fStack_224 + fVar133 * fVar10 +
                       fVar138 * fVar24 +
                       fStack_c4 * fVar99 + fVar111 * fStack_a4 + fVar104 * fStack_244 +
                       fVar103 * fStack_264 + fVar135 * fVar17;
                  *(float *)((long)pauVar63[-2] + 0x18) =
                       fVar107 * fStack_2a0 + fVar113 + fVar117 * fStack_220 + fVar133 * fVar11 +
                       fVar138 * fVar25 +
                       fStack_c0 * fVar99 + fVar111 * fStack_a0 + fVar104 * fStack_240 +
                       fVar103 * fStack_260 + fVar135 * fVar18;
                  *(float *)((long)pauVar63[-2] + 0x1c) = fVar121;
                  *(float *)pauVar62[-2] =
                       fVar107 * fVar93 + fVar108 + fVar117 * fVar134 + fVar133 * local_f8 +
                       fVar138 * fVar27 +
                       fVar99 * fVar88 + fVar111 * fVar122 + fVar104 * local_188 +
                       fVar103 * local_338 + fVar135 * local_2d8;
                  *(float *)((long)pauVar62[-2] + 4) =
                       fVar107 * fVar35 + fVar110 + fVar117 * fVar39 + fVar133 * fStack_f4 +
                       fVar138 * fVar28 +
                       fVar99 * fVar94 + fVar111 * fStack_214 + fVar104 * fStack_184 +
                       fVar103 * fStack_334 + fVar135 * fStack_2d4;
                  *(float *)((long)pauVar62[-2] + 8) =
                       fVar107 * fVar116 + fVar119 + fVar117 * fVar91 + fVar133 * fStack_f0 +
                       fVar138 * fVar29 +
                       fVar99 * fVar140 + fVar111 * fStack_210 + fVar104 * fStack_180 +
                       fVar103 * fStack_330 + fVar135 * fStack_2d0;
                  *(float *)((long)pauVar62[-2] + 0xc) =
                       fVar107 * fVar36 + fVar130 + fVar117 * fVar40 + fVar133 * fStack_ec +
                       fVar138 * fVar30 +
                       fVar99 * fVar115 + fVar111 * fStack_20c + fVar104 * fStack_17c +
                       fVar103 * fStack_32c + fVar135 * fStack_2cc;
                  *(float *)((long)pauVar62[-2] + 0x10) =
                       fVar107 * fVar118 + fVar131 + fVar117 * fVar98 + fVar133 * fStack_e8 +
                       fVar138 * fVar31 +
                       fVar99 * fVar90 + fVar111 * fStack_208 + fVar104 * fStack_178 +
                       fVar103 * fStack_328 + fVar135 * fStack_2c8;
                  *(float *)((long)pauVar62[-2] + 0x14) =
                       fVar107 * fVar37 + fVar139 + fVar117 * fVar41 + fVar133 * fStack_e4 +
                       fVar138 * fVar32 +
                       fVar99 * fVar92 + fVar111 * fStack_204 + fVar104 * fStack_174 +
                       fVar103 * fStack_324 + fVar135 * fStack_2c4;
                  *(float *)((long)pauVar62[-2] + 0x18) =
                       fVar107 * fVar38 + fVar137 + fVar117 * fVar101 + fVar133 * fStack_e0 +
                       fVar138 * fVar33 +
                       fVar99 * fVar26 + fVar111 * fStack_200 + fVar104 * fStack_170 +
                       fVar103 * fStack_320 + fVar135 * fStack_2c0;
                  *(float *)((long)pauVar62[-2] + 0x1c) = fVar120;
                  fVar136 = *(float *)((long)pvVar66 + lVar80 + 0xc);
                  fVar106 = *(float *)((long)pvVar81 + lVar80 + 0xc);
                  auVar125 = ZEXT3264(auVar84);
                  fVar107 = *(float *)((long)pvVar70 + lVar80 + 0xc);
                  fVar104 = fVar114 + fVar120 + fVar114 + fVar121 + fVar121 +
                            *(float *)((long)pauVar63[-1] + 0x1c);
                  auVar100._0_4_ =
                       local_d8 * fVar111 + local_2b8 * fVar99 +
                       fVar117 * local_258 + fVar103 * local_238 + fVar135 * fVar87 +
                       *(float *)pauVar63[-1] +
                       fVar138 * fVar12 + fVar136 * auVar58._0_4_ + fVar106 * local_278 +
                       fVar107 * fVar19;
                  auVar100._4_4_ =
                       fStack_d4 * fVar111 + fStack_2b4 * fVar99 +
                       fVar117 * fStack_254 + fVar103 * fStack_234 + fVar135 * fVar102 +
                       *(float *)((long)pauVar63[-1] + 4) +
                       fVar138 * fVar13 + fVar136 * auVar58._4_4_ + fVar106 * fStack_274 +
                       fVar107 * fVar20;
                  auVar100._8_4_ =
                       fStack_d0 * fVar111 + fStack_2b0 * fVar99 +
                       fVar117 * fStack_250 + fVar103 * fStack_230 + fVar135 * fVar86 +
                       *(float *)((long)pauVar63[-1] + 8) +
                       fVar138 * fVar14 + fVar136 * auVar58._8_4_ + fVar106 * fStack_270 +
                       fVar107 * fVar21;
                  auVar100._12_4_ =
                       fStack_cc * fVar111 + fStack_2ac * fVar99 +
                       fVar117 * fStack_24c + fVar103 * fStack_22c + fVar135 * fVar89 +
                       *(float *)((long)pauVar63[-1] + 0xc) +
                       fVar138 * fVar15 + fVar136 * fStack_ac + fVar106 * fStack_26c +
                       fVar107 * fVar22;
                  auVar100._16_4_ =
                       fStack_c8 * fVar111 + fStack_2a8 * fVar99 +
                       fVar117 * fStack_248 + fVar103 * fStack_228 + fVar135 * fVar9 +
                       *(float *)((long)pauVar63[-1] + 0x10) +
                       fVar138 * fVar16 + fVar136 * fStack_a8 + fVar106 * fStack_268 +
                       fVar107 * fVar23;
                  auVar100._20_4_ =
                       fStack_c4 * fVar111 + fStack_2a4 * fVar99 +
                       fVar117 * fStack_244 + fVar103 * fStack_224 + fVar135 * fVar10 +
                       *(float *)((long)pauVar63[-1] + 0x14) +
                       fVar138 * fVar17 + fVar136 * fStack_a4 + fVar106 * fStack_264 +
                       fVar107 * fVar24;
                  auVar100._24_4_ =
                       fStack_c0 * fVar111 + fStack_2a0 * fVar99 +
                       fVar117 * fStack_240 + fVar103 * fStack_220 + fVar135 * fVar11 +
                       *(float *)((long)pauVar63[-1] + 0x18) +
                       fVar138 * fVar18 + fVar136 * fStack_a0 + fVar106 * fStack_260 +
                       fVar107 * fVar25;
                  auVar100._28_4_ = fVar104 + fVar121 + fVar138 + fVar138 + fVar138;
                  auVar96._0_4_ =
                       fVar111 * fVar88 + fVar99 * fVar93 + fVar117 * local_188 + fVar103 * fVar134
                       + local_f8 * fVar135 + fVar138 * local_2d8 + *(float *)pauVar62[-1] +
                       fVar136 * fVar122 + fVar106 * local_338 + fVar107 * fVar27;
                  auVar96._4_4_ =
                       fVar111 * fVar94 + fVar99 * fVar35 + fVar117 * fStack_184 + fVar103 * fVar39
                       + fStack_f4 * fVar135 + fVar138 * fStack_2d4 +
                       *(float *)((long)pauVar62[-1] + 4) +
                       fVar136 * fStack_214 + fVar106 * fStack_334 + fVar107 * fVar28;
                  auVar96._8_4_ =
                       fVar111 * fVar140 + fVar99 * fVar116 +
                       fVar117 * fStack_180 + fVar103 * fVar91 +
                       fStack_f0 * fVar135 + fVar138 * fStack_2d0 +
                       *(float *)((long)pauVar62[-1] + 8) +
                       fVar136 * fStack_210 + fVar106 * fStack_330 + fVar107 * fVar29;
                  auVar96._12_4_ =
                       fVar111 * fVar115 + fVar99 * fVar36 + fVar117 * fStack_17c + fVar103 * fVar40
                       + fStack_ec * fVar135 + fVar138 * fStack_2cc +
                       *(float *)((long)pauVar62[-1] + 0xc) +
                       fVar136 * fStack_20c + fVar106 * fStack_32c + fVar107 * fVar30;
                  auVar96._16_4_ =
                       fVar111 * fVar90 + fVar99 * fVar118 + fVar117 * fStack_178 + fVar103 * fVar98
                       + fStack_e8 * fVar135 + fVar138 * fStack_2c8 +
                       *(float *)((long)pauVar62[-1] + 0x10) +
                       fVar136 * fStack_208 + fVar106 * fStack_328 + fVar107 * fVar31;
                  auVar96._20_4_ =
                       fVar111 * fVar92 + fVar99 * fVar37 + fVar117 * fStack_174 + fVar103 * fVar41
                       + fStack_e4 * fVar135 + fVar138 * fStack_2c4 +
                       *(float *)((long)pauVar62[-1] + 0x14) +
                       fVar136 * fStack_204 + fVar106 * fStack_324 + fVar107 * fVar32;
                  auVar96._24_4_ =
                       fVar111 * fVar26 + fVar99 * fVar38 + fVar117 * fStack_170 + fVar103 * fVar101
                       + fStack_e0 * fVar135 + fVar138 * fStack_2c0 +
                       *(float *)((long)pauVar62[-1] + 0x18) +
                       fVar136 * fStack_200 + fVar106 * fStack_320 + fVar107 * fVar33;
                  auVar96._28_4_ =
                       fVar111 + fVar99 + fVar117 + fVar103 + fVar135 + fVar138 +
                       *(float *)((long)pauVar62[-1] + 0x1c) + fVar103 + fVar111 + fVar99 + fVar104;
                  pauVar63[-1] = auVar100;
                  pauVar62[-1] = auVar96;
                  uVar68 = uVar67 + 2;
                  lVar80 = lVar80 + 8;
                  iVar65 = uVar67 + 3;
                  uVar67 = uVar68;
                  fVar106 = fVar138;
                  fVar136 = fVar34;
                } while (iVar65 < (int)uVar6);
                pauVar69 = pauVar77 + 2;
                pauVar73 = pauVar76 + 2;
                pvVar66 = (void *)((long)pvVar66 + lVar80);
                pvVar81 = (void *)((long)pvVar81 + lVar80);
                pvVar70 = (void *)((long)pvVar70 + lVar80);
                auVar112 = ZEXT3264(auVar83);
              }
              iVar65 = uVar6 - uVar68;
              if (iVar65 != 0 && (int)uVar68 <= (int)uVar6) {
                lVar80 = 0;
                lVar78 = 0;
                in_ZMM1 = ZEXT3264(auVar125._0_32_);
                auVar126 = auVar125;
                do {
                  fVar106 = *(float *)((long)pvVar66 + lVar80);
                  fVar107 = *(float *)((long)pvVar66 + lVar80 + 4);
                  fVar99 = *(float *)((long)pvVar66 + lVar80 + 8);
                  fVar104 = *(float *)((long)pvVar81 + lVar80);
                  fVar117 = *(float *)((long)pvVar81 + lVar80 + 4);
                  fVar103 = *(float *)((long)pvVar81 + lVar80 + 8);
                  fVar133 = *(float *)((long)pvVar70 + lVar80);
                  fVar135 = *(float *)((long)pvVar70 + lVar80 + 4);
                  fVar105 = *(float *)((long)pvVar70 + lVar80 + 8);
                  pfVar1 = (float *)((long)*pauVar69 + lVar80 * 2 * 4);
                  fVar138 = fVar138 + fVar136 + fVar136 + fVar136 + fVar136;
                  auVar124._0_4_ =
                       fVar106 * local_2b8 + *pfVar1 + fVar117 * local_238 + fVar133 * fVar87 +
                       fVar105 * fVar19 +
                       fVar107 * local_d8 + fVar99 * local_b8 + fVar104 * local_258 +
                       fVar103 * local_278 + fVar135 * fVar12;
                  auVar124._4_4_ =
                       fVar106 * fStack_2b4 + pfVar1[1] + fVar117 * fStack_234 + fVar133 * fVar102 +
                       fVar105 * fVar20 +
                       fVar107 * fStack_d4 + fVar99 * fStack_b4 + fVar104 * fStack_254 +
                       fVar103 * fStack_274 + fVar135 * fVar13;
                  auVar124._8_4_ =
                       fVar106 * fStack_2b0 + pfVar1[2] + fVar117 * fStack_230 + fVar133 * fVar86 +
                       fVar105 * fVar21 +
                       fVar107 * fStack_d0 + fVar99 * fStack_b0 + fVar104 * fStack_250 +
                       fVar103 * fStack_270 + fVar135 * fVar14;
                  auVar124._12_4_ =
                       fVar106 * fStack_2ac + pfVar1[3] + fVar117 * fStack_22c + fVar133 * fVar89 +
                       fVar105 * fVar22 +
                       fVar107 * fStack_cc + fVar99 * fStack_ac + fVar104 * fStack_24c +
                       fVar103 * fStack_26c + fVar135 * fVar15;
                  auVar124._16_4_ =
                       fVar106 * fStack_2a8 + pfVar1[4] + fVar117 * fStack_228 + fVar133 * fVar9 +
                       fVar105 * fVar23 +
                       fVar107 * fStack_c8 + fVar99 * fStack_a8 + fVar104 * fStack_248 +
                       fVar103 * fStack_268 + fVar135 * fVar16;
                  auVar124._20_4_ =
                       fVar106 * fStack_2a4 + pfVar1[5] + fVar117 * fStack_224 + fVar133 * fVar10 +
                       fVar105 * fVar24 +
                       fVar107 * fStack_c4 + fVar99 * fStack_a4 + fVar104 * fStack_244 +
                       fVar103 * fStack_264 + fVar135 * fVar17;
                  auVar124._24_4_ =
                       fVar106 * fStack_2a0 + pfVar1[6] + fVar117 * fStack_220 + fVar133 * fVar11 +
                       fVar105 * fVar25 +
                       fVar107 * fStack_c0 + fVar99 * fStack_a0 + fVar104 * fStack_240 +
                       fVar103 * fStack_260 + fVar135 * fVar18;
                  auVar124._28_4_ =
                       auVar126._28_4_ + pfVar1[7] + fVar136 + fVar136 + fVar136 + fVar138;
                  auVar126 = ZEXT3264(auVar124);
                  fVar111 = fVar99 + fVar99 + fVar107;
                  pfVar1 = (float *)((long)*pauVar73 + lVar80 * 2 * 4);
                  auVar97._0_4_ =
                       fVar117 * fVar134 + fVar93 * fVar106 + *pfVar1 + fVar133 * auVar125._0_4_ +
                       fVar105 * fVar27 +
                       fVar104 * auVar112._0_4_ + fVar99 * fVar122 + fVar107 * fVar88 +
                       fVar103 * local_338 + fVar135 * local_2d8;
                  auVar97._4_4_ =
                       fVar117 * fVar39 + fVar35 * fVar106 + pfVar1[1] + fVar133 * auVar125._4_4_ +
                       fVar105 * fVar28 +
                       fVar104 * auVar112._4_4_ + fVar99 * fStack_214 + fVar107 * fVar94 +
                       fVar103 * fStack_334 + fVar135 * fStack_2d4;
                  auVar97._8_4_ =
                       fVar117 * fVar91 + fVar116 * fVar106 + pfVar1[2] + fVar133 * auVar125._8_4_ +
                       fVar105 * fVar29 +
                       fVar104 * auVar112._8_4_ + fVar99 * fStack_210 + fVar107 * fVar140 +
                       fVar103 * fStack_330 + fVar135 * fStack_2d0;
                  auVar97._12_4_ =
                       fVar117 * fVar40 + fVar36 * fVar106 + pfVar1[3] + fVar133 * auVar125._12_4_ +
                       fVar105 * fVar30 +
                       fVar104 * auVar112._12_4_ + fVar99 * fStack_20c + fVar107 * fVar115 +
                       fVar103 * fStack_32c + fVar135 * fStack_2cc;
                  auVar97._16_4_ =
                       fVar117 * fVar98 + fVar118 * fVar106 + pfVar1[4] + fVar133 * auVar125._16_4_
                       + fVar105 * fVar31 +
                       fVar104 * auVar112._16_4_ + fVar99 * fStack_208 + fVar107 * fVar90 +
                       fVar103 * fStack_328 + fVar135 * fStack_2c8;
                  auVar97._20_4_ =
                       fVar117 * fVar41 + fVar37 * fVar106 + pfVar1[5] + fVar133 * auVar125._20_4_ +
                       fVar105 * fVar32 +
                       fVar104 * auVar112._20_4_ + fVar99 * fStack_204 + fVar107 * fVar92 +
                       fVar103 * fStack_324 + fVar135 * fStack_2c4;
                  auVar97._24_4_ =
                       fVar117 * fVar101 + fVar38 * fVar106 + pfVar1[6] + fVar133 * auVar125._24_4_
                       + fVar105 * fVar33 +
                       fVar104 * auVar112._24_4_ + fVar99 * fStack_200 + fVar107 * fVar26 +
                       fVar103 * fStack_320 + fVar135 * fStack_2c0;
                  auVar97._28_4_ =
                       fVar99 + fVar106 + pfVar1[7] + fVar133 + fVar105 +
                       fVar111 + fVar103 + fVar135;
                  *(undefined1 (*) [32])((long)*pauVar69 + lVar80 * 2 * 4) = auVar124;
                  *(undefined1 (*) [32])((long)*pauVar73 + lVar80 * 2 * 4) = auVar97;
                  lVar78 = lVar78 + -0x20;
                  lVar80 = lVar80 + 4;
                  iVar65 = iVar65 + -1;
                  fVar136 = fVar34;
                } while (iVar65 != 0);
                pauVar69 = (undefined1 (*) [32])((long)pauVar69 - lVar78);
                pauVar73 = (undefined1 (*) [32])((long)pauVar73 - lVar78);
                pvVar66 = (void *)((long)pvVar66 + lVar80);
                pvVar81 = (void *)((long)pvVar81 + lVar80);
                pvVar70 = (void *)((long)pvVar70 + lVar80);
                auVar112 = ZEXT3264(auVar112._0_32_);
                auVar125 = ZEXT3264(auVar125._0_32_);
              }
              pvVar66 = (void *)((long)pvVar66 + 8);
              pvVar81 = (void *)((long)pvVar81 + 8);
              pvVar70 = (void *)((long)pvVar70 + 8);
              iVar64 = iVar64 + 1;
            } while (iVar64 != iVar7);
          }
          pfVar74 = pfVar74 + 0x48;
          local_1b8 = local_1b8 + 0x24;
          local_348 = local_348 + 1;
        } while (local_348 != uVar5);
      }
      uVar71 = uVar71 + 1;
    } while (uVar71 != (uint)(iVar8 >> 1));
  }
  if ((int)uVar72 != iVar8) {
    do {
      iVar64 = 1;
      if (top_blob->dims != 3) {
        iVar64 = top_blob->d;
      }
      if (_bias == (Mat *)0x0) {
        auVar82 = ZEXT1632(ZEXT816(0) << 0x40);
      }
      else {
        auVar82 = *(undefined1 (*) [32])(&_bias->data + uVar72 * 4);
      }
      pauVar75 = (undefined1 (*) [32])
                 (top_blob->cstep * uVar72 * top_blob->elemsize + (long)top_blob->data);
      iVar64 = iVar64 * top_blob->h * top_blob->w;
      pauVar69 = pauVar75;
      if (0 < iVar64) {
        do {
          *pauVar69 = auVar82;
          iVar64 = iVar64 + -1;
          pauVar69 = pauVar69 + 1;
        } while (iVar64 != 0);
      }
      if (0 < (int)uVar5) {
        pfVar74 = (float *)(kernel->cstep * uVar72 * kernel->elemsize + (long)kernel->data);
        uVar71 = 0;
        do {
          if (0 < iVar7) {
            fVar34 = *pfVar74;
            fVar93 = pfVar74[1];
            uVar49 = *(undefined8 *)pfVar74;
            fVar35 = pfVar74[2];
            fVar116 = pfVar74[3];
            uVar50 = *(undefined8 *)(pfVar74 + 2);
            fVar36 = pfVar74[4];
            fVar118 = pfVar74[5];
            uVar51 = *(undefined8 *)(pfVar74 + 4);
            fVar37 = pfVar74[6];
            uVar52 = *(undefined8 *)(pfVar74 + 6);
            fVar10 = pfVar74[8];
            fVar11 = pfVar74[9];
            fVar12 = pfVar74[10];
            fVar13 = pfVar74[0xb];
            fVar14 = pfVar74[0xc];
            fVar15 = pfVar74[0xd];
            fVar16 = pfVar74[0xe];
            fVar17 = pfVar74[0xf];
            local_238 = *(float *)*(undefined1 (*) [28])(pfVar74 + 0x10);
            fStack_234 = pfVar74[0x11];
            fStack_230 = pfVar74[0x12];
            fStack_22c = pfVar74[0x13];
            fStack_228 = pfVar74[0x14];
            fStack_224 = pfVar74[0x15];
            fStack_220 = pfVar74[0x16];
            auVar60 = *(undefined1 (*) [28])(pfVar74 + 0x10);
            pauVar69 = (undefined1 (*) [32])(pfVar74 + 0x18);
            fVar111 = *(float *)*pauVar69;
            fVar136 = pfVar74[0x19];
            fVar138 = pfVar74[0x1a];
            fVar87 = pfVar74[0x1b];
            fVar102 = pfVar74[0x1c];
            fVar86 = pfVar74[0x1d];
            fVar89 = pfVar74[0x1e];
            auVar59 = *(undefined1 (*) [28])*pauVar69;
            fVar9 = pfVar74[0x1f];
            auVar3 = *pauVar69;
            fVar18 = pfVar74[0x20];
            fVar19 = pfVar74[0x21];
            uVar42 = *(undefined8 *)(pfVar74 + 0x20);
            fVar20 = pfVar74[0x22];
            fVar21 = pfVar74[0x23];
            uVar43 = *(undefined8 *)(pfVar74 + 0x22);
            fVar22 = pfVar74[0x24];
            fVar23 = pfVar74[0x25];
            uVar44 = *(undefined8 *)(pfVar74 + 0x24);
            fVar24 = pfVar74[0x26];
            fVar25 = pfVar74[0x27];
            uVar45 = *(undefined8 *)(pfVar74 + 0x26);
            auVar82 = *(undefined1 (*) [32])(pfVar74 + 0x28);
            auVar112 = ZEXT3264(auVar82);
            pauVar69 = (undefined1 (*) [32])(pfVar74 + 0x30);
            fVar109 = *(float *)*pauVar69;
            fVar88 = pfVar74[0x31];
            fVar94 = pfVar74[0x32];
            fVar140 = pfVar74[0x33];
            fVar115 = pfVar74[0x34];
            fVar90 = pfVar74[0x35];
            fVar92 = pfVar74[0x36];
            auVar61 = *(undefined1 (*) [28])*pauVar69;
            fVar26 = pfVar74[0x37];
            auVar4 = *pauVar69;
            fVar27 = pfVar74[0x38];
            fVar28 = pfVar74[0x39];
            fVar29 = pfVar74[0x3a];
            fVar30 = pfVar74[0x3b];
            fVar31 = pfVar74[0x3c];
            fVar32 = pfVar74[0x3d];
            fVar33 = pfVar74[0x3e];
            fVar38 = pfVar74[0x40];
            fVar134 = pfVar74[0x41];
            uVar46 = *(undefined8 *)(pfVar74 + 0x40);
            fVar39 = pfVar74[0x42];
            fVar91 = pfVar74[0x43];
            uVar47 = *(undefined8 *)(pfVar74 + 0x42);
            fVar40 = pfVar74[0x44];
            fVar98 = pfVar74[0x45];
            uVar48 = *(undefined8 *)(pfVar74 + 0x44);
            fVar41 = pfVar74[0x46];
            pvVar66 = (void *)(bottom_blob->cstep * uVar71 * bottom_blob->elemsize +
                              (long)bottom_blob->data);
            lVar80 = (long)bottom_blob->w * bottom_blob->elemsize;
            pvVar70 = (void *)((long)pvVar66 + lVar80 * 2);
            pvVar81 = (void *)(lVar80 + (long)pvVar66);
            iVar64 = 0;
            pauVar69 = pauVar75;
            fVar101 = fVar18;
            fVar122 = fVar20;
            fVar106 = fVar22;
            fVar107 = fVar24;
            fVar99 = fVar34;
            fVar104 = fVar35;
            fVar117 = fVar36;
            fVar103 = fVar37;
            fVar133 = fVar38;
            fVar135 = fVar39;
            fVar105 = fVar40;
            do {
              local_2b8 = (float)uVar49;
              fStack_2b4 = (float)((ulong)uVar49 >> 0x20);
              fStack_2b0 = (float)uVar50;
              fStack_2ac = (float)((ulong)uVar50 >> 0x20);
              fStack_2a8 = (float)uVar51;
              fStack_2a4 = (float)((ulong)uVar51 >> 0x20);
              fStack_2a0 = (float)uVar52;
              fStack_29c = (float)((ulong)uVar52 >> 0x20);
              local_338 = (float)uVar42;
              fStack_330 = (float)uVar43;
              fStack_328 = (float)uVar44;
              fStack_254 = auVar4._4_4_;
              fStack_250 = auVar4._8_4_;
              fStack_24c = auVar4._12_4_;
              fStack_248 = auVar4._16_4_;
              fStack_244 = auVar4._20_4_;
              fStack_240 = auVar4._24_4_;
              local_2d8 = (float)uVar46;
              fStack_2d4 = (float)((ulong)uVar46 >> 0x20);
              fStack_2d0 = (float)uVar47;
              fStack_2cc = (float)((ulong)uVar47 >> 0x20);
              fStack_2c8 = (float)uVar48;
              fStack_2c4 = (float)((ulong)uVar48 >> 0x20);
              fStack_320 = (float)uVar45;
              local_278 = auVar3._0_4_;
              fStack_274 = auVar3._4_4_;
              fStack_270 = auVar3._8_4_;
              fStack_26c = auVar3._12_4_;
              fStack_268 = auVar3._16_4_;
              fStack_264 = auVar3._20_4_;
              fStack_260 = auVar3._24_4_;
              local_258 = auVar61._0_4_;
              if ((int)uVar6 < 4) {
                uVar68 = 0;
                pauVar79 = pauVar69;
              }
              else {
                iVar65 = 3;
                lVar80 = 0;
                pauVar79 = pauVar69;
                do {
                  pauVar73 = pauVar79;
                  fVar111 = *(float *)((long)pvVar66 + lVar80);
                  fVar136 = *(float *)((long)pvVar66 + lVar80 + 4);
                  fVar138 = *(float *)((long)pvVar66 + lVar80 + 8);
                  fVar87 = *(float *)((long)pvVar81 + lVar80);
                  fVar102 = *(float *)((long)pvVar81 + lVar80 + 4);
                  fVar86 = *(float *)((long)pvVar81 + lVar80 + 8);
                  fVar89 = *(float *)((long)pvVar70 + lVar80);
                  fVar109 = *(float *)((long)pvVar70 + lVar80 + 4);
                  fVar88 = *(float *)((long)pvVar70 + lVar80 + 8);
                  pfVar1 = (float *)((long)*pauVar69 + lVar80 * 2 * 4);
                  fVar115 = fVar111 + pfVar1[7];
                  local_238 = auVar60._0_4_;
                  fStack_234 = auVar60._4_4_;
                  fStack_230 = auVar60._8_4_;
                  fStack_22c = auVar60._12_4_;
                  fStack_228 = auVar60._16_4_;
                  fStack_224 = auVar60._20_4_;
                  fStack_220 = auVar60._24_4_;
                  fVar90 = auVar59._0_4_;
                  fVar92 = auVar59._4_4_;
                  fVar93 = auVar59._8_4_;
                  fVar116 = auVar59._12_4_;
                  fVar118 = auVar59._16_4_;
                  fVar134 = auVar59._20_4_;
                  fVar91 = auVar59._24_4_;
                  local_218 = auVar82._0_4_;
                  fStack_214 = auVar82._4_4_;
                  fStack_210 = auVar82._8_4_;
                  fStack_20c = auVar82._12_4_;
                  fStack_208 = auVar82._16_4_;
                  fStack_204 = auVar82._20_4_;
                  fStack_200 = auVar82._24_4_;
                  fVar101 = fVar115 + fVar115 + fVar115 + fVar17;
                  fVar94 = *(float *)((long)pvVar66 + lVar80 + 0xc);
                  fVar140 = *(float *)((long)pvVar81 + lVar80 + 0xc);
                  fVar98 = fVar101 + fVar115 + fVar115 + fStack_29c + fVar17 + fVar17;
                  fVar115 = *(float *)((long)pvVar70 + lVar80 + 0xc);
                  *pfVar1 = fVar88 * fVar38 +
                            local_258 * fVar89 + fVar111 * fVar34 + *pfVar1 + fVar102 * fVar18 +
                            fVar109 * fVar27 +
                            fVar86 * local_218 +
                            fVar136 * fVar10 + fVar138 * local_238 + fVar87 * fVar90;
                  pfVar1[1] = fVar88 * fStack_2d4 +
                              fStack_254 * fVar89 +
                              fVar111 * fStack_2b4 + pfVar1[1] + fVar102 * fVar19 +
                              fVar109 * fVar28 +
                              fVar86 * fStack_214 +
                              fVar136 * fVar11 + fVar138 * fStack_234 + fVar87 * fVar92;
                  pfVar1[2] = fVar88 * fVar39 +
                              fStack_250 * fVar89 + fVar111 * fVar35 + pfVar1[2] + fVar102 * fVar20
                              + fVar109 * fVar29 +
                                fVar86 * fStack_210 +
                                fVar136 * fVar12 + fVar138 * fStack_230 + fVar87 * fVar93;
                  pfVar1[3] = fVar88 * fStack_2cc +
                              fStack_24c * fVar89 +
                              fVar111 * fStack_2ac + pfVar1[3] + fVar102 * fVar21 +
                              fVar109 * fVar30 +
                              fVar86 * fStack_20c +
                              fVar136 * fVar13 + fVar138 * fStack_22c + fVar87 * fVar116;
                  pfVar1[4] = fVar88 * fVar40 +
                              fStack_248 * fVar89 + fVar111 * fVar36 + pfVar1[4] + fVar102 * fVar22
                              + fVar109 * fVar31 +
                                fVar86 * fStack_208 +
                                fVar136 * fVar14 + fVar138 * fStack_228 + fVar87 * fVar118;
                  pfVar1[5] = fVar88 * fStack_2c4 +
                              fStack_244 * fVar89 +
                              fVar111 * fStack_2a4 + pfVar1[5] + fVar102 * fVar23 +
                              fVar109 * fVar32 +
                              fVar86 * fStack_204 +
                              fVar136 * fVar15 + fVar138 * fStack_224 + fVar87 * fVar134;
                  pfVar1[6] = fVar88 * fVar41 +
                              fStack_240 * fVar89 + fVar111 * fVar37 + pfVar1[6] + fVar102 * fVar24
                              + fVar109 * fVar33 +
                                fVar86 * fStack_200 +
                                fVar136 * fVar16 + fVar138 * fStack_220 + fVar87 * fVar91;
                  pfVar1[7] = fVar98;
                  fVar101 = fVar101 + fVar98;
                  fVar122 = fVar101 + fVar136 + fVar102;
                  fStack_1fc = auVar82._28_4_;
                  fVar98 = pfVar1[0xf];
                  fVar111 = *(float *)((long)pvVar66 + lVar80 + 0x10);
                  fVar87 = *(float *)((long)pvVar81 + lVar80 + 0x10);
                  fVar89 = *(float *)((long)pvVar70 + lVar80 + 0x10);
                  fVar101 = fVar122 + fVar98 + fVar136 + fVar140 + fVar9 + fVar101 + fVar101;
                  pfVar1[8] = fVar138 * fVar10 + fVar136 * fVar34 +
                              fVar86 * fVar18 + fVar90 * fVar102 + pfVar1[8] +
                              fVar88 * fVar27 + local_258 * fVar109 + fVar94 * local_238 +
                              fVar140 * local_218 + fVar115 * fVar38;
                  pfVar1[9] = fVar138 * fVar11 + fVar136 * fStack_2b4 +
                              fVar86 * fVar19 + fVar92 * fVar102 + pfVar1[9] +
                              fVar88 * fVar28 + fStack_254 * fVar109 + fVar94 * fStack_234 +
                              fVar140 * fStack_214 + fVar115 * fStack_2d4;
                  pfVar1[10] = fVar138 * fVar12 + fVar136 * fVar35 +
                               fVar86 * fVar20 + fVar93 * fVar102 + pfVar1[10] +
                               fVar88 * fVar29 + fStack_250 * fVar109 + fVar94 * fStack_230 +
                               fVar140 * fStack_210 + fVar115 * fVar39;
                  pfVar1[0xb] = fVar138 * fVar13 + fVar136 * fStack_2ac +
                                fVar86 * fVar21 + fVar116 * fVar102 + pfVar1[0xb] +
                                fVar88 * fVar30 + fStack_24c * fVar109 + fVar94 * fStack_22c +
                                fVar140 * fStack_20c + fVar115 * fStack_2cc;
                  pfVar1[0xc] = fVar138 * fVar14 + fVar136 * fVar36 +
                                fVar86 * fVar22 + fVar118 * fVar102 + pfVar1[0xc] +
                                fVar88 * fVar31 + fStack_248 * fVar109 + fVar94 * fStack_228 +
                                fVar140 * fStack_208 + fVar115 * fVar40;
                  pfVar1[0xd] = fVar138 * fVar15 + fVar136 * fStack_2a4 +
                                fVar86 * fVar23 + fVar134 * fVar102 + pfVar1[0xd] +
                                fVar88 * fVar32 + fStack_244 * fVar109 + fVar94 * fStack_224 +
                                fVar140 * fStack_204 + fVar115 * fStack_2c4;
                  pfVar1[0xe] = fVar138 * fVar16 + fVar136 * fVar37 +
                                fVar86 * fVar24 + fVar91 * fVar102 + pfVar1[0xe] +
                                fVar88 * fVar33 + fStack_240 * fVar109 + fVar94 * fStack_220 +
                                fVar140 * fStack_200 + fVar115 * fVar41;
                  pfVar1[0xf] = fVar101;
                  fVar136 = *(float *)((long)pvVar66 + lVar80 + 0x14);
                  fVar102 = *(float *)((long)pvVar81 + lVar80 + 0x14);
                  fVar98 = fVar138 + fVar101 + fVar122 + fVar122 + fVar98 + pfVar1[0x17] +
                           fVar122 + fVar122 + fVar138 + fVar122 + fVar25;
                  fVar109 = *(float *)((long)pvVar70 + lVar80 + 0x14);
                  pfVar1[0x10] = fVar90 * fVar86 + fVar138 * fVar34 +
                                 local_258 * fVar88 + fVar94 * fVar10 + pfVar1[0x10] +
                                 fVar89 * fVar38 +
                                 fVar87 * local_218 +
                                 fVar111 * local_238 + fVar140 * fVar18 + fVar115 * fVar27;
                  pfVar1[0x11] = fVar92 * fVar86 + fVar138 * fStack_2b4 +
                                 fStack_254 * fVar88 + fVar94 * fVar11 + pfVar1[0x11] +
                                 fVar89 * fStack_2d4 +
                                 fVar87 * fStack_214 +
                                 fVar111 * fStack_234 + fVar140 * fVar19 + fVar115 * fVar28;
                  pfVar1[0x12] = fVar93 * fVar86 + fVar138 * fVar35 +
                                 fStack_250 * fVar88 + fVar94 * fVar12 + pfVar1[0x12] +
                                 fVar89 * fVar39 +
                                 fVar87 * fStack_210 +
                                 fVar111 * fStack_230 + fVar140 * fVar20 + fVar115 * fVar29;
                  pfVar1[0x13] = fVar116 * fVar86 + fVar138 * fStack_2ac +
                                 fStack_24c * fVar88 + fVar94 * fVar13 + pfVar1[0x13] +
                                 fVar89 * fStack_2cc +
                                 fVar87 * fStack_20c +
                                 fVar111 * fStack_22c + fVar140 * fVar21 + fVar115 * fVar30;
                  pfVar1[0x14] = fVar118 * fVar86 + fVar138 * fVar36 +
                                 fStack_248 * fVar88 + fVar94 * fVar14 + pfVar1[0x14] +
                                 fVar89 * fVar40 +
                                 fVar87 * fStack_208 +
                                 fVar111 * fStack_228 + fVar140 * fVar22 + fVar115 * fVar31;
                  pfVar1[0x15] = fVar134 * fVar86 + fVar138 * fStack_2a4 +
                                 fStack_244 * fVar88 + fVar94 * fVar15 + pfVar1[0x15] +
                                 fVar89 * fStack_2c4 +
                                 fVar87 * fStack_204 +
                                 fVar111 * fStack_224 + fVar140 * fVar23 + fVar115 * fVar32;
                  pfVar1[0x16] = fVar91 * fVar86 + fVar138 * fVar37 +
                                 fStack_240 * fVar88 + fVar94 * fVar16 + pfVar1[0x16] +
                                 fVar89 * fVar41 +
                                 fVar87 * fStack_200 +
                                 fVar111 * fStack_220 + fVar140 * fVar24 + fVar115 * fVar33;
                  pfVar1[0x17] = fVar98;
                  fVar98 = fStack_29c + fVar98;
                  fVar138 = fVar90 * fVar140 + fVar94 * fVar34 +
                            fVar115 * local_258 + fVar111 * fVar10 + pfVar1[0x18];
                  fVar86 = fVar92 * fVar140 + fVar94 * fStack_2b4 +
                           fVar115 * fStack_254 + fVar111 * fVar11 + pfVar1[0x19];
                  fVar88 = fVar93 * fVar140 + fVar94 * fVar35 +
                           fVar115 * fStack_250 + fVar111 * fVar12 + pfVar1[0x1a];
                  fVar90 = fVar116 * fVar140 + fVar94 * fStack_2ac +
                           fVar115 * fStack_24c + fVar111 * fVar13 + pfVar1[0x1b];
                  fVar92 = fVar118 * fVar140 + fVar94 * fVar36 +
                           fVar115 * fStack_248 + fVar111 * fVar14 + pfVar1[0x1c];
                  fVar93 = fVar134 * fVar140 + fVar94 * fStack_2a4 +
                           fVar115 * fStack_244 + fVar111 * fVar15 + pfVar1[0x1d];
                  fVar111 = fVar91 * fVar140 + fVar94 * fVar37 +
                            fVar115 * fStack_240 + fVar111 * fVar16 + pfVar1[0x1e];
                  fVar94 = fVar98 + fVar94 + fStack_1fc + pfVar1[0x1f];
                  in_ZMM1 = ZEXT3264(CONCAT428(fVar94,CONCAT424(fVar111,CONCAT420(fVar93,CONCAT416(
                                                  fVar92,CONCAT412(fVar90,CONCAT48(fVar88,CONCAT44(
                                                  fVar86,fVar138))))))));
                  auVar83._0_4_ =
                       fVar138 + fVar87 * local_338 + fVar89 * fVar27 + fVar136 * local_238 +
                                 fVar102 * local_218 + fVar109 * fVar38;
                  auVar83._4_4_ =
                       fVar86 + fVar87 * fVar19 + fVar89 * fVar28 + fVar136 * fStack_234 +
                                fVar102 * fStack_214 + fVar109 * fStack_2d4;
                  auVar83._8_4_ =
                       fVar88 + fVar87 * fStack_330 + fVar89 * fVar29 + fVar136 * fStack_230 +
                                fVar102 * fStack_210 + fVar109 * fVar39;
                  auVar83._12_4_ =
                       fVar90 + fVar87 * fVar21 + fVar89 * fVar30 + fVar136 * fStack_22c +
                                fVar102 * fStack_20c + fVar109 * fStack_2cc;
                  auVar83._16_4_ =
                       fVar92 + fVar87 * fStack_328 + fVar89 * fVar31 + fVar136 * fStack_228 +
                                fVar102 * fStack_208 + fVar109 * fVar40;
                  auVar83._20_4_ =
                       fVar93 + fVar87 * fVar23 + fVar89 * fVar32 + fVar136 * fStack_224 +
                                fVar102 * fStack_204 + fVar109 * fStack_2c4;
                  auVar83._24_4_ =
                       fVar111 + fVar87 * fStack_320 + fVar89 * fVar33 + fVar136 * fStack_220 +
                                 fVar102 * fStack_200 + fVar109 * fVar41;
                  auVar83._28_4_ = fVar94 + fVar98 + fVar89 + fVar98 + fVar98 + fVar98;
                  *(undefined1 (*) [32])(pfVar1 + 0x18) = auVar83;
                  lVar80 = lVar80 + 0x10;
                  iVar65 = iVar65 + 4;
                  pauVar79 = (undefined1 (*) [32])(pfVar1 + 0x20);
                } while (iVar65 < (int)uVar6);
                pvVar66 = (void *)((long)pvVar66 + lVar80);
                pvVar81 = (void *)((long)pvVar81 + lVar80);
                pvVar70 = (void *)((long)pvVar70 + lVar80);
                auVar112 = ZEXT3264(auVar82);
                pauVar79 = pauVar73 + 4;
                fVar111 = local_278;
                fVar136 = fStack_274;
                fVar138 = fStack_270;
                fVar87 = fStack_26c;
                fVar102 = fStack_268;
                fVar86 = fStack_264;
                fVar89 = fStack_260;
                fVar101 = local_338;
                fVar122 = fStack_330;
                fVar106 = fStack_328;
                fVar107 = fStack_320;
                fVar109 = local_258;
                fVar88 = fStack_254;
                fVar94 = fStack_250;
                fVar140 = fStack_24c;
                fVar115 = fStack_248;
                fVar90 = fStack_244;
                fVar92 = fStack_240;
                fVar99 = local_2b8;
                fVar93 = fStack_2b4;
                fVar104 = fStack_2b0;
                fVar116 = fStack_2ac;
                fVar117 = fStack_2a8;
                fVar118 = fStack_2a4;
                fVar103 = fStack_2a0;
                fVar133 = local_2d8;
                fVar134 = fStack_2d4;
                fVar135 = fStack_2d0;
                fVar91 = fStack_2cc;
                fVar105 = fStack_2c8;
                fVar98 = fStack_2c4;
                in_register_0000159c = fVar26;
                uVar68 = uVar6 & 0xfffffffc;
              }
              if ((int)(uVar68 | 1) < (int)uVar6) {
                lVar80 = 0;
                pauVar69 = pauVar79;
                uVar67 = uVar68;
                do {
                  pauVar73 = pauVar69;
                  fVar111 = *(float *)((long)pvVar66 + lVar80);
                  fVar136 = *(float *)((long)pvVar66 + lVar80 + 4);
                  fVar138 = *(float *)((long)pvVar66 + lVar80 + 8);
                  fVar87 = *(float *)((long)pvVar81 + lVar80);
                  fVar102 = *(float *)((long)pvVar81 + lVar80 + 4);
                  fVar86 = *(float *)((long)pvVar81 + lVar80 + 8);
                  fVar89 = *(float *)((long)pvVar70 + lVar80);
                  fVar109 = *(float *)((long)pvVar70 + lVar80 + 4);
                  fVar140 = in_register_0000159c + in_ZMM1._28_4_;
                  fVar88 = *(float *)((long)pvVar70 + lVar80 + 8);
                  pauVar69 = (undefined1 (*) [32])((long)pauVar79[2] + lVar80 * 2 * 4);
                  fVar91 = *(float *)((long)pauVar69[-2] + 4);
                  fVar98 = *(float *)((long)pauVar69[-2] + 8);
                  fVar101 = *(float *)((long)pauVar69[-2] + 0xc);
                  fVar122 = *(float *)((long)pauVar69[-2] + 0x10);
                  fVar106 = *(float *)((long)pauVar69[-2] + 0x14);
                  fVar107 = *(float *)((long)pauVar69[-2] + 0x18);
                  fVar115 = auVar112._0_4_;
                  fVar90 = auVar112._4_4_;
                  fVar92 = auVar112._8_4_;
                  fVar93 = auVar112._12_4_;
                  fVar116 = auVar112._16_4_;
                  fVar118 = auVar112._20_4_;
                  fVar134 = auVar112._24_4_;
                  in_register_0000159c = *(float *)((long)pvVar66 + lVar80 + 0xc);
                  fVar94 = *(float *)((long)pvVar81 + lVar80 + 0xc);
                  fVar99 = fVar89 + fVar89 + fVar140 + fVar111 + *(float *)((long)pauVar69[-2] +
                                                                           0x1c) +
                           fVar140 + fVar140 + fVar140 + fVar87;
                  fVar140 = *(float *)((long)pvVar70 + lVar80 + 0xc);
                  *(float *)pauVar69[-2] =
                       fVar88 * local_2d8 +
                       fVar89 * local_258 +
                       fVar102 * local_338 + fVar111 * local_2b8 + *(float *)pauVar69[-2] +
                       fVar109 * fVar27 +
                       fVar86 * fVar115 +
                       fVar138 * local_238 + fVar136 * fVar10 + fVar87 * local_278;
                  *(float *)((long)pauVar69[-2] + 4) =
                       fVar88 * fStack_2d4 +
                       fVar89 * fStack_254 + fVar102 * fVar19 + fVar111 * fStack_2b4 + fVar91 +
                       fVar109 * fVar28 +
                       fVar86 * fVar90 +
                       fVar138 * fStack_234 + fVar136 * fVar11 + fVar87 * fStack_274;
                  *(float *)((long)pauVar69[-2] + 8) =
                       fVar88 * fStack_2d0 +
                       fVar89 * fStack_250 + fVar102 * fStack_330 + fVar111 * fStack_2b0 + fVar98 +
                       fVar109 * fVar29 +
                       fVar86 * fVar92 +
                       fVar138 * fStack_230 + fVar136 * fVar12 + fVar87 * fStack_270;
                  *(float *)((long)pauVar69[-2] + 0xc) =
                       fVar88 * fStack_2cc +
                       fVar89 * fStack_24c + fVar102 * fVar21 + fVar111 * fStack_2ac + fVar101 +
                       fVar109 * fVar30 +
                       fVar86 * fVar93 +
                       fVar138 * fStack_22c + fVar136 * fVar13 + fVar87 * fStack_26c;
                  *(float *)((long)pauVar69[-2] + 0x10) =
                       fVar88 * fStack_2c8 +
                       fVar89 * fStack_248 + fVar102 * fStack_328 + fVar111 * fStack_2a8 + fVar122 +
                       fVar109 * fVar31 +
                       fVar86 * fVar116 +
                       fVar138 * fStack_228 + fVar136 * fVar14 + fVar87 * fStack_268;
                  *(float *)((long)pauVar69[-2] + 0x14) =
                       fVar88 * fStack_2c4 +
                       fVar89 * fStack_244 + fVar102 * fVar23 + fVar111 * fStack_2a4 + fVar106 +
                       fVar109 * fVar32 +
                       fVar86 * fVar118 +
                       fVar138 * fStack_224 + fVar136 * fVar15 + fVar87 * fStack_264;
                  *(float *)((long)pauVar69[-2] + 0x18) =
                       fVar88 * fVar41 +
                       fVar89 * fStack_240 + fVar102 * fStack_320 + fVar111 * fStack_2a0 + fVar107 +
                       fVar109 * fVar33 +
                       fVar86 * fVar134 +
                       fVar138 * fStack_220 + fVar136 * fVar16 + fVar87 * fStack_260;
                  *(float *)((long)pauVar69[-2] + 0x1c) = fVar99;
                  auVar112 = ZEXT3264(auVar112._0_32_);
                  fVar122 = fVar102 + fVar136 + fVar136 + fVar99;
                  fVar111 = fVar102 * local_278 + fVar86 * local_338 +
                            fVar138 * fVar10 + fVar136 * local_2b8 + *(float *)pauVar69[-1];
                  fVar87 = fVar102 * fStack_274 + fVar86 * fVar19 +
                           fVar138 * fVar11 + fVar136 * fStack_2b4 +
                           *(float *)((long)pauVar69[-1] + 4);
                  fVar89 = fVar102 * fStack_270 + fVar86 * fStack_330 +
                           fVar138 * fVar12 + fVar136 * fStack_2b0 +
                           *(float *)((long)pauVar69[-1] + 8);
                  fVar91 = fVar102 * fStack_26c + fVar86 * fVar21 +
                           fVar138 * fVar13 + fVar136 * fStack_2ac +
                           *(float *)((long)pauVar69[-1] + 0xc);
                  fVar98 = fVar102 * fStack_268 + fVar86 * fStack_328 +
                           fVar138 * fVar14 + fVar136 * fStack_2a8 +
                           *(float *)((long)pauVar69[-1] + 0x10);
                  fVar101 = fVar102 * fStack_264 + fVar86 * fVar23 +
                            fVar138 * fVar15 + fVar136 * fStack_2a4 +
                            *(float *)((long)pauVar69[-1] + 0x14);
                  fVar136 = fVar102 * fStack_260 + fVar86 * fStack_320 +
                            fVar138 * fVar16 + fVar136 * fStack_2a0 +
                            *(float *)((long)pauVar69[-1] + 0x18);
                  fVar138 = fVar122 + *(float *)((long)pauVar69[-1] + 0x1c);
                  in_ZMM1 = ZEXT3264(CONCAT428(fVar138,CONCAT424(fVar136,CONCAT420(fVar101,CONCAT416
                                                  (fVar98,CONCAT412(fVar91,CONCAT48(fVar89,CONCAT44(
                                                  fVar87,fVar111))))))));
                  auVar84._0_4_ =
                       fVar111 + fVar109 * local_258 + fVar27 * fVar88 +
                                 in_register_0000159c * local_238 + fVar94 * fVar115 +
                                 local_2d8 * fVar140;
                  auVar84._4_4_ =
                       fVar87 + fVar109 * fStack_254 + fVar28 * fVar88 +
                                in_register_0000159c * fStack_234 + fVar94 * fVar90 +
                                fStack_2d4 * fVar140;
                  auVar84._8_4_ =
                       fVar89 + fVar109 * fStack_250 + fVar29 * fVar88 +
                                in_register_0000159c * fStack_230 + fVar94 * fVar92 +
                                fStack_2d0 * fVar140;
                  auVar84._12_4_ =
                       fVar91 + fVar109 * fStack_24c + fVar30 * fVar88 +
                                in_register_0000159c * fStack_22c + fVar94 * fVar93 +
                                fStack_2cc * fVar140;
                  auVar84._16_4_ =
                       fVar98 + fVar109 * fStack_248 + fVar31 * fVar88 +
                                in_register_0000159c * fStack_228 + fVar94 * fVar116 +
                                fStack_2c8 * fVar140;
                  auVar84._20_4_ =
                       fVar101 + fVar109 * fStack_244 + fVar32 * fVar88 +
                                 in_register_0000159c * fStack_224 + fVar94 * fVar118 +
                                 fStack_2c4 * fVar140;
                  auVar84._24_4_ =
                       fVar136 + fVar109 * fStack_240 + fVar33 * fVar88 +
                                 in_register_0000159c * fStack_220 + fVar94 * fVar134 +
                                 fVar41 * fVar140;
                  auVar84._28_4_ = fVar138 + fStack_29c + fVar9 + fVar9 + fVar9 + fVar122;
                  pauVar69[-1] = auVar84;
                  uVar68 = uVar67 + 2;
                  lVar80 = lVar80 + 8;
                  iVar65 = uVar67 + 3;
                  uVar67 = uVar68;
                } while (iVar65 < (int)uVar6);
                pauVar79 = pauVar73 + 2;
                pvVar66 = (void *)((long)pvVar66 + lVar80);
                pvVar81 = (void *)((long)pvVar81 + lVar80);
                pvVar70 = (void *)((long)pvVar70 + lVar80);
                fVar111 = local_278;
                fVar136 = fStack_274;
                fVar138 = fStack_270;
                fVar87 = fStack_26c;
                fVar102 = fStack_268;
                fVar86 = fStack_264;
                fVar89 = fStack_260;
                fVar101 = local_338;
                fVar122 = fStack_330;
                fVar106 = fStack_328;
                fVar107 = fStack_320;
                fVar109 = local_258;
                fVar88 = fStack_254;
                fVar94 = fStack_250;
                fVar140 = fStack_24c;
                fVar115 = fStack_248;
                fVar90 = fStack_244;
                fVar92 = fStack_240;
                fVar99 = local_2b8;
                fVar93 = fStack_2b4;
                fVar104 = fStack_2b0;
                fVar116 = fStack_2ac;
                fVar117 = fStack_2a8;
                fVar118 = fStack_2a4;
                fVar103 = fStack_2a0;
                fVar133 = local_2d8;
                fVar134 = fStack_2d4;
                fVar135 = fStack_2d0;
                fVar91 = fStack_2cc;
                fVar105 = fStack_2c8;
                fVar98 = fStack_2c4;
              }
              iVar65 = uVar6 - uVar68;
              pauVar69 = pauVar79;
              if (iVar65 != 0 && (int)uVar68 <= (int)uVar6) {
                lVar80 = 0;
                do {
                  fVar123 = *(float *)((long)pvVar66 + lVar80);
                  fVar127 = *(float *)((long)pvVar66 + lVar80 + 4);
                  fVar128 = *(float *)((long)pvVar66 + lVar80 + 8);
                  fVar129 = *(float *)((long)pvVar81 + lVar80);
                  fVar113 = *(float *)((long)pvVar81 + lVar80 + 4);
                  fVar108 = *(float *)((long)pvVar81 + lVar80 + 8);
                  pfVar1 = (float *)((long)*pauVar79 + lVar80 * 2 * 4);
                  fVar110 = *(float *)((long)pvVar70 + lVar80);
                  fVar119 = *(float *)((long)pvVar70 + lVar80 + 4);
                  fVar130 = *(float *)((long)pvVar70 + lVar80 + 8);
                  fVar131 = fVar127 * fVar10 + local_238 * fVar128 + fVar129 * fVar111 +
                            auVar112._0_4_ * fVar108 + fVar27 * fVar119;
                  fVar139 = fVar127 * fVar11 + fStack_234 * fVar128 + fVar129 * fVar136 +
                            auVar112._4_4_ * fVar108 + fVar28 * fVar119;
                  fVar137 = fVar127 * fVar12 + fStack_230 * fVar128 + fVar129 * fVar138 +
                            auVar112._8_4_ * fVar108 + fVar29 * fVar119;
                  fVar120 = fVar127 * fVar13 + fStack_22c * fVar128 + fVar129 * fVar87 +
                            auVar112._12_4_ * fVar108 + fVar30 * fVar119;
                  fVar114 = fVar127 * fVar14 + fStack_228 * fVar128 + fVar129 * fVar102 +
                            auVar112._16_4_ * fVar108 + fVar31 * fVar119;
                  fVar121 = fVar127 * fVar15 + fStack_224 * fVar128 + fVar129 * fVar86 +
                            auVar112._20_4_ * fVar108 + fVar32 * fVar119;
                  fVar132 = fVar127 * fVar16 + fStack_220 * fVar128 + fVar129 * fVar89 +
                            auVar112._24_4_ * fVar108 + fVar33 * fVar119;
                  fVar119 = fVar127 + fVar128 + fVar129 + fVar108 + fVar119;
                  in_ZMM1 = ZEXT3264(CONCAT428(fVar119,CONCAT424(fVar132,CONCAT420(fVar121,CONCAT416
                                                  (fVar114,CONCAT412(fVar120,CONCAT48(fVar137,
                                                  CONCAT44(fVar139,fVar131))))))));
                  auVar85._0_4_ =
                       fVar99 * fVar123 + *pfVar1 + fVar113 * fVar101 + fVar110 * fVar109 +
                       fVar133 * fVar130 + fVar131;
                  auVar85._4_4_ =
                       fVar93 * fVar123 + pfVar1[1] + fVar113 * fVar19 + fVar110 * fVar88 +
                       fVar134 * fVar130 + fVar139;
                  auVar85._8_4_ =
                       fVar104 * fVar123 + pfVar1[2] + fVar113 * fVar122 + fVar110 * fVar94 +
                       fVar135 * fVar130 + fVar137;
                  auVar85._12_4_ =
                       fVar116 * fVar123 + pfVar1[3] + fVar113 * fVar21 + fVar110 * fVar140 +
                       fVar91 * fVar130 + fVar120;
                  auVar85._16_4_ =
                       fVar117 * fVar123 + pfVar1[4] + fVar113 * fVar106 + fVar110 * fVar115 +
                       fVar105 * fVar130 + fVar114;
                  auVar85._20_4_ =
                       fVar118 * fVar123 + pfVar1[5] + fVar113 * fVar23 + fVar110 * fVar90 +
                       fVar98 * fVar130 + fVar121;
                  auVar85._24_4_ =
                       fVar103 * fVar123 + pfVar1[6] + fVar113 * fVar107 + fVar110 * fVar92 +
                       fVar41 * fVar130 + fVar132;
                  auVar85._28_4_ = fVar123 + pfVar1[7] + fVar113 + fVar110 + fVar130 + fVar119;
                  *(undefined1 (*) [32])((long)*pauVar79 + lVar80 * 2 * 4) = auVar85;
                  pauVar69 = pauVar69 + 1;
                  lVar80 = lVar80 + 4;
                  iVar65 = iVar65 + -1;
                } while (iVar65 != 0);
                pvVar66 = (void *)((long)pvVar66 + lVar80);
                pvVar81 = (void *)((long)pvVar81 + lVar80);
                pvVar70 = (void *)((long)pvVar70 + lVar80);
              }
              pvVar66 = (void *)((long)pvVar66 + 8);
              pvVar81 = (void *)((long)pvVar81 + 8);
              pvVar70 = (void *)((long)pvVar70 + 8);
              iVar64 = iVar64 + 1;
            } while (iVar64 != iVar7);
          }
          pfVar74 = pfVar74 + 0x48;
          uVar71 = uVar71 + 1;
        } while (uVar71 != uVar5);
      }
      uVar72 = uVar72 + 1;
    } while ((long)uVar72 < (long)iVar8);
  }
  return;
}

Assistant:

static void conv3x3s1_pack1to8_avx(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    int inch = bottom_blob.c;
    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;
    const float* bias = _bias;

    int nn_outch = outch >> 1;
    int remain_outch_start = nn_outch << 1;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int pp = 0; pp < nn_outch; pp++)
    {
        int p = pp * 2;

        Mat out0 = top_blob.channel(p);
        Mat out1 = top_blob.channel(p + 1);

        __m256 _bias0 = bias ? _mm256_loadu_ps((const float*)bias + p * 8) : _mm256_set1_ps(0.f);
        __m256 _bias1 = bias ? _mm256_loadu_ps((const float*)bias + (p + 1) * 8) : _mm256_set1_ps(0.f);
        out0.fill(_bias0);
        out1.fill(_bias1);

        const float* k0 = kernel.channel(p);
        const float* k1 = kernel.channel(p + 1);

        for (int q = 0; q < inch; q++)
        {
            float* outptr0 = out0;
            float* outptr1 = out1;

            const Mat img0 = bottom_blob.channel(q);

            const float* r0 = img0.row(0);
            const float* r1 = img0.row(1);
            const float* r2 = img0.row(2);

            __m256 _k00_0 = _mm256_loadu_ps(k0);
            __m256 _k01_0 = _mm256_loadu_ps(k0 + 8);
            __m256 _k02_0 = _mm256_loadu_ps(k0 + 16);
            __m256 _k10_0 = _mm256_loadu_ps(k0 + 24);
            __m256 _k11_0 = _mm256_loadu_ps(k0 + 32);
            __m256 _k12_0 = _mm256_loadu_ps(k0 + 40);
            __m256 _k20_0 = _mm256_loadu_ps(k0 + 48);
            __m256 _k21_0 = _mm256_loadu_ps(k0 + 56);
            __m256 _k22_0 = _mm256_loadu_ps(k0 + 64);

            __m256 _k00_1 = _mm256_loadu_ps(k1);
            __m256 _k01_1 = _mm256_loadu_ps(k1 + 8);
            __m256 _k02_1 = _mm256_loadu_ps(k1 + 16);
            __m256 _k10_1 = _mm256_loadu_ps(k1 + 24);
            __m256 _k11_1 = _mm256_loadu_ps(k1 + 32);
            __m256 _k12_1 = _mm256_loadu_ps(k1 + 40);
            __m256 _k20_1 = _mm256_loadu_ps(k1 + 48);
            __m256 _k21_1 = _mm256_loadu_ps(k1 + 56);
            __m256 _k22_1 = _mm256_loadu_ps(k1 + 64);

            int i = 0;

            for (; i < outh; i++)
            {
                int j = 0;
                for (; j + 3 < outw; j += 4)
                {
                    __m256 _sum00 = _mm256_loadu_ps(outptr0);
                    __m256 _sum10 = _mm256_loadu_ps(outptr1);

                    __m256 _r01 = _mm256_broadcast_ss(r0);
                    __m256 _r02 = _mm256_broadcast_ss(r0 + 1);
                    __m256 _r03 = _mm256_broadcast_ss(r0 + 2);
                    __m256 _r11 = _mm256_broadcast_ss(r1);
                    __m256 _r12 = _mm256_broadcast_ss(r1 + 1);
                    __m256 _r13 = _mm256_broadcast_ss(r1 + 2);
                    __m256 _r21 = _mm256_broadcast_ss(r2);
                    __m256 _r22 = _mm256_broadcast_ss(r2 + 1);
                    __m256 _r23 = _mm256_broadcast_ss(r2 + 2);

                    _sum00 = _mm256_comp_fmadd_ps(_r01, _k00_0, _sum00);
                    _sum00 = _mm256_comp_fmadd_ps(_r02, _k01_0, _sum00);
                    _sum00 = _mm256_comp_fmadd_ps(_r03, _k02_0, _sum00);
                    _sum00 = _mm256_comp_fmadd_ps(_r11, _k10_0, _sum00);
                    _sum00 = _mm256_comp_fmadd_ps(_r12, _k11_0, _sum00);
                    _sum00 = _mm256_comp_fmadd_ps(_r13, _k12_0, _sum00);
                    _sum00 = _mm256_comp_fmadd_ps(_r21, _k20_0, _sum00);
                    _sum00 = _mm256_comp_fmadd_ps(_r22, _k21_0, _sum00);
                    _sum00 = _mm256_comp_fmadd_ps(_r23, _k22_0, _sum00);

                    _sum10 = _mm256_comp_fmadd_ps(_r01, _k00_1, _sum10);
                    _sum10 = _mm256_comp_fmadd_ps(_r02, _k01_1, _sum10);
                    _sum10 = _mm256_comp_fmadd_ps(_r03, _k02_1, _sum10);
                    _sum10 = _mm256_comp_fmadd_ps(_r11, _k10_1, _sum10);
                    _sum10 = _mm256_comp_fmadd_ps(_r12, _k11_1, _sum10);
                    _sum10 = _mm256_comp_fmadd_ps(_r13, _k12_1, _sum10);
                    _sum10 = _mm256_comp_fmadd_ps(_r21, _k20_1, _sum10);
                    _sum10 = _mm256_comp_fmadd_ps(_r22, _k21_1, _sum10);
                    _sum10 = _mm256_comp_fmadd_ps(_r23, _k22_1, _sum10);

                    _mm256_storeu_ps(outptr0, _sum00);
                    _mm256_storeu_ps(outptr1, _sum10);

                    __m256 _sum01 = _mm256_loadu_ps(outptr0 + 8);
                    __m256 _sum11 = _mm256_loadu_ps(outptr1 + 8);

                    __m256 _r04 = _mm256_broadcast_ss(r0 + 3);
                    __m256 _r14 = _mm256_broadcast_ss(r1 + 3);
                    __m256 _r24 = _mm256_broadcast_ss(r2 + 3);

                    _sum01 = _mm256_comp_fmadd_ps(_r02, _k00_0, _sum01);
                    _sum01 = _mm256_comp_fmadd_ps(_r03, _k01_0, _sum01);
                    _sum01 = _mm256_comp_fmadd_ps(_r04, _k02_0, _sum01);
                    _sum01 = _mm256_comp_fmadd_ps(_r12, _k10_0, _sum01);
                    _sum01 = _mm256_comp_fmadd_ps(_r13, _k11_0, _sum01);
                    _sum01 = _mm256_comp_fmadd_ps(_r14, _k12_0, _sum01);
                    _sum01 = _mm256_comp_fmadd_ps(_r22, _k20_0, _sum01);
                    _sum01 = _mm256_comp_fmadd_ps(_r23, _k21_0, _sum01);
                    _sum01 = _mm256_comp_fmadd_ps(_r24, _k22_0, _sum01);

                    _sum11 = _mm256_comp_fmadd_ps(_r02, _k00_1, _sum11);
                    _sum11 = _mm256_comp_fmadd_ps(_r03, _k01_1, _sum11);
                    _sum11 = _mm256_comp_fmadd_ps(_r04, _k02_1, _sum11);
                    _sum11 = _mm256_comp_fmadd_ps(_r12, _k10_1, _sum11);
                    _sum11 = _mm256_comp_fmadd_ps(_r13, _k11_1, _sum11);
                    _sum11 = _mm256_comp_fmadd_ps(_r14, _k12_1, _sum11);
                    _sum11 = _mm256_comp_fmadd_ps(_r22, _k20_1, _sum11);
                    _sum11 = _mm256_comp_fmadd_ps(_r23, _k21_1, _sum11);
                    _sum11 = _mm256_comp_fmadd_ps(_r24, _k22_1, _sum11);

                    _mm256_storeu_ps(outptr0 + 8, _sum01);
                    _mm256_storeu_ps(outptr1 + 8, _sum11);

                    __m256 _sum02 = _mm256_loadu_ps(outptr0 + 16);
                    __m256 _sum12 = _mm256_loadu_ps(outptr1 + 16);

                    __m256 _r05 = _mm256_broadcast_ss(r0 + 4);
                    __m256 _r15 = _mm256_broadcast_ss(r1 + 4);
                    __m256 _r25 = _mm256_broadcast_ss(r2 + 4);

                    _sum02 = _mm256_comp_fmadd_ps(_r03, _k00_0, _sum02);
                    _sum02 = _mm256_comp_fmadd_ps(_r04, _k01_0, _sum02);
                    _sum02 = _mm256_comp_fmadd_ps(_r05, _k02_0, _sum02);
                    _sum02 = _mm256_comp_fmadd_ps(_r13, _k10_0, _sum02);
                    _sum02 = _mm256_comp_fmadd_ps(_r14, _k11_0, _sum02);
                    _sum02 = _mm256_comp_fmadd_ps(_r15, _k12_0, _sum02);
                    _sum02 = _mm256_comp_fmadd_ps(_r23, _k20_0, _sum02);
                    _sum02 = _mm256_comp_fmadd_ps(_r24, _k21_0, _sum02);
                    _sum02 = _mm256_comp_fmadd_ps(_r25, _k22_0, _sum02);

                    _sum12 = _mm256_comp_fmadd_ps(_r03, _k00_1, _sum12);
                    _sum12 = _mm256_comp_fmadd_ps(_r04, _k01_1, _sum12);
                    _sum12 = _mm256_comp_fmadd_ps(_r05, _k02_1, _sum12);
                    _sum12 = _mm256_comp_fmadd_ps(_r13, _k10_1, _sum12);
                    _sum12 = _mm256_comp_fmadd_ps(_r14, _k11_1, _sum12);
                    _sum12 = _mm256_comp_fmadd_ps(_r15, _k12_1, _sum12);
                    _sum12 = _mm256_comp_fmadd_ps(_r23, _k20_1, _sum12);
                    _sum12 = _mm256_comp_fmadd_ps(_r24, _k21_1, _sum12);
                    _sum12 = _mm256_comp_fmadd_ps(_r25, _k22_1, _sum12);

                    _mm256_storeu_ps(outptr0 + 16, _sum02);
                    _mm256_storeu_ps(outptr1 + 16, _sum12);

                    __m256 _r06 = _mm256_broadcast_ss(r0 + 5);
                    __m256 _r16 = _mm256_broadcast_ss(r1 + 5);
                    __m256 _r26 = _mm256_broadcast_ss(r2 + 5);

                    __m256 _sum03 = _mm256_loadu_ps(outptr0 + 24);
                    __m256 _sum13 = _mm256_loadu_ps(outptr1 + 24);

                    _sum03 = _mm256_comp_fmadd_ps(_r04, _k00_0, _sum03);
                    _sum03 = _mm256_comp_fmadd_ps(_r05, _k01_0, _sum03);
                    _sum03 = _mm256_comp_fmadd_ps(_r06, _k02_0, _sum03);
                    _sum03 = _mm256_comp_fmadd_ps(_r14, _k10_0, _sum03);
                    _sum03 = _mm256_comp_fmadd_ps(_r15, _k11_0, _sum03);
                    _sum03 = _mm256_comp_fmadd_ps(_r16, _k12_0, _sum03);
                    _sum03 = _mm256_comp_fmadd_ps(_r24, _k20_0, _sum03);
                    _sum03 = _mm256_comp_fmadd_ps(_r25, _k21_0, _sum03);
                    _sum03 = _mm256_comp_fmadd_ps(_r26, _k22_0, _sum03);

                    _sum13 = _mm256_comp_fmadd_ps(_r04, _k00_1, _sum13);
                    _sum13 = _mm256_comp_fmadd_ps(_r05, _k01_1, _sum13);
                    _sum13 = _mm256_comp_fmadd_ps(_r06, _k02_1, _sum13);
                    _sum13 = _mm256_comp_fmadd_ps(_r14, _k10_1, _sum13);
                    _sum13 = _mm256_comp_fmadd_ps(_r15, _k11_1, _sum13);
                    _sum13 = _mm256_comp_fmadd_ps(_r16, _k12_1, _sum13);
                    _sum13 = _mm256_comp_fmadd_ps(_r24, _k20_1, _sum13);
                    _sum13 = _mm256_comp_fmadd_ps(_r25, _k21_1, _sum13);
                    _sum13 = _mm256_comp_fmadd_ps(_r26, _k22_1, _sum13);

                    _mm256_storeu_ps(outptr0 + 24, _sum03);
                    _mm256_storeu_ps(outptr1 + 24, _sum13);

                    r0 += 4;
                    r1 += 4;
                    r2 += 4;
                    outptr0 += 32;
                    outptr1 += 32;
                }

                for (; j + 1 < outw; j += 2)
                {
                    __m256 _sum00 = _mm256_loadu_ps(outptr0);
                    __m256 _sum10 = _mm256_loadu_ps(outptr1);

                    __m256 _r01 = _mm256_broadcast_ss(r0);
                    __m256 _r02 = _mm256_broadcast_ss(r0 + 1);
                    __m256 _r03 = _mm256_broadcast_ss(r0 + 2);
                    __m256 _r11 = _mm256_broadcast_ss(r1);
                    __m256 _r12 = _mm256_broadcast_ss(r1 + 1);
                    __m256 _r13 = _mm256_broadcast_ss(r1 + 2);
                    __m256 _r21 = _mm256_broadcast_ss(r2);
                    __m256 _r22 = _mm256_broadcast_ss(r2 + 1);
                    __m256 _r23 = _mm256_broadcast_ss(r2 + 2);

                    _sum00 = _mm256_comp_fmadd_ps(_r01, _k00_0, _sum00);
                    _sum00 = _mm256_comp_fmadd_ps(_r02, _k01_0, _sum00);
                    _sum00 = _mm256_comp_fmadd_ps(_r03, _k02_0, _sum00);
                    _sum00 = _mm256_comp_fmadd_ps(_r11, _k10_0, _sum00);
                    _sum00 = _mm256_comp_fmadd_ps(_r12, _k11_0, _sum00);
                    _sum00 = _mm256_comp_fmadd_ps(_r13, _k12_0, _sum00);
                    _sum00 = _mm256_comp_fmadd_ps(_r21, _k20_0, _sum00);
                    _sum00 = _mm256_comp_fmadd_ps(_r22, _k21_0, _sum00);
                    _sum00 = _mm256_comp_fmadd_ps(_r23, _k22_0, _sum00);

                    _sum10 = _mm256_comp_fmadd_ps(_r01, _k00_1, _sum10);
                    _sum10 = _mm256_comp_fmadd_ps(_r02, _k01_1, _sum10);
                    _sum10 = _mm256_comp_fmadd_ps(_r03, _k02_1, _sum10);
                    _sum10 = _mm256_comp_fmadd_ps(_r11, _k10_1, _sum10);
                    _sum10 = _mm256_comp_fmadd_ps(_r12, _k11_1, _sum10);
                    _sum10 = _mm256_comp_fmadd_ps(_r13, _k12_1, _sum10);
                    _sum10 = _mm256_comp_fmadd_ps(_r21, _k20_1, _sum10);
                    _sum10 = _mm256_comp_fmadd_ps(_r22, _k21_1, _sum10);
                    _sum10 = _mm256_comp_fmadd_ps(_r23, _k22_1, _sum10);

                    _mm256_storeu_ps(outptr0, _sum00);
                    _mm256_storeu_ps(outptr1, _sum10);

                    __m256 _sum01 = _mm256_loadu_ps(outptr0 + 8);
                    __m256 _sum11 = _mm256_loadu_ps(outptr1 + 8);

                    __m256 _r04 = _mm256_broadcast_ss(r0 + 3);
                    __m256 _r14 = _mm256_broadcast_ss(r1 + 3);
                    __m256 _r24 = _mm256_broadcast_ss(r2 + 3);

                    _sum01 = _mm256_comp_fmadd_ps(_r02, _k00_0, _sum01);
                    _sum01 = _mm256_comp_fmadd_ps(_r03, _k01_0, _sum01);
                    _sum01 = _mm256_comp_fmadd_ps(_r04, _k02_0, _sum01);
                    _sum01 = _mm256_comp_fmadd_ps(_r12, _k10_0, _sum01);
                    _sum01 = _mm256_comp_fmadd_ps(_r13, _k11_0, _sum01);
                    _sum01 = _mm256_comp_fmadd_ps(_r14, _k12_0, _sum01);
                    _sum01 = _mm256_comp_fmadd_ps(_r22, _k20_0, _sum01);
                    _sum01 = _mm256_comp_fmadd_ps(_r23, _k21_0, _sum01);
                    _sum01 = _mm256_comp_fmadd_ps(_r24, _k22_0, _sum01);

                    _sum11 = _mm256_comp_fmadd_ps(_r02, _k00_1, _sum11);
                    _sum11 = _mm256_comp_fmadd_ps(_r03, _k01_1, _sum11);
                    _sum11 = _mm256_comp_fmadd_ps(_r04, _k02_1, _sum11);
                    _sum11 = _mm256_comp_fmadd_ps(_r12, _k10_1, _sum11);
                    _sum11 = _mm256_comp_fmadd_ps(_r13, _k11_1, _sum11);
                    _sum11 = _mm256_comp_fmadd_ps(_r14, _k12_1, _sum11);
                    _sum11 = _mm256_comp_fmadd_ps(_r22, _k20_1, _sum11);
                    _sum11 = _mm256_comp_fmadd_ps(_r23, _k21_1, _sum11);
                    _sum11 = _mm256_comp_fmadd_ps(_r24, _k22_1, _sum11);

                    _mm256_storeu_ps(outptr0 + 8, _sum01);
                    _mm256_storeu_ps(outptr1 + 8, _sum11);

                    r0 += 2;
                    r1 += 2;
                    r2 += 2;
                    outptr0 += 16;
                    outptr1 += 16;
                }

                for (; j < outw; j++)
                {
                    __m256 _sum00 = _mm256_loadu_ps(outptr0);
                    __m256 _sum10 = _mm256_loadu_ps(outptr1);

                    __m256 _r01 = _mm256_broadcast_ss(r0);
                    __m256 _r02 = _mm256_broadcast_ss(r0 + 1);
                    __m256 _r03 = _mm256_broadcast_ss(r0 + 2);
                    __m256 _r11 = _mm256_broadcast_ss(r1);
                    __m256 _r12 = _mm256_broadcast_ss(r1 + 1);
                    __m256 _r13 = _mm256_broadcast_ss(r1 + 2);
                    __m256 _r21 = _mm256_broadcast_ss(r2);
                    __m256 _r22 = _mm256_broadcast_ss(r2 + 1);
                    __m256 _r23 = _mm256_broadcast_ss(r2 + 2);

                    _sum00 = _mm256_comp_fmadd_ps(_r01, _k00_0, _sum00);
                    _sum00 = _mm256_comp_fmadd_ps(_r02, _k01_0, _sum00);
                    _sum00 = _mm256_comp_fmadd_ps(_r03, _k02_0, _sum00);
                    _sum00 = _mm256_comp_fmadd_ps(_r11, _k10_0, _sum00);
                    _sum00 = _mm256_comp_fmadd_ps(_r12, _k11_0, _sum00);
                    _sum00 = _mm256_comp_fmadd_ps(_r13, _k12_0, _sum00);
                    _sum00 = _mm256_comp_fmadd_ps(_r21, _k20_0, _sum00);
                    _sum00 = _mm256_comp_fmadd_ps(_r22, _k21_0, _sum00);
                    _sum00 = _mm256_comp_fmadd_ps(_r23, _k22_0, _sum00);

                    _sum10 = _mm256_comp_fmadd_ps(_r01, _k00_1, _sum10);
                    _sum10 = _mm256_comp_fmadd_ps(_r02, _k01_1, _sum10);
                    _sum10 = _mm256_comp_fmadd_ps(_r03, _k02_1, _sum10);
                    _sum10 = _mm256_comp_fmadd_ps(_r11, _k10_1, _sum10);
                    _sum10 = _mm256_comp_fmadd_ps(_r12, _k11_1, _sum10);
                    _sum10 = _mm256_comp_fmadd_ps(_r13, _k12_1, _sum10);
                    _sum10 = _mm256_comp_fmadd_ps(_r21, _k20_1, _sum10);
                    _sum10 = _mm256_comp_fmadd_ps(_r22, _k21_1, _sum10);
                    _sum10 = _mm256_comp_fmadd_ps(_r23, _k22_1, _sum10);

                    _mm256_storeu_ps(outptr0, _sum00);
                    _mm256_storeu_ps(outptr1, _sum10);

                    r0 += 1;
                    r1 += 1;
                    r2 += 1;
                    outptr0 += 8;
                    outptr1 += 8;
                }

                r0 += 2;
                r1 += 2;
                r2 += 2;
            }

            k0 += 9 * 8;
            k1 += 9 * 8;
        }
    }

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = remain_outch_start; p < outch; p++)
    {
        Mat out0 = top_blob.channel(p);

        __m256 _bias0 = bias ? _mm256_loadu_ps((const float*)bias + p * 8) : _mm256_set1_ps(0.f);
        out0.fill(_bias0);

        const float* k0 = kernel.channel(p);

        for (int q = 0; q < inch; q++)
        {
            float* outptr0 = out0.row(0);

            const Mat img0 = bottom_blob.channel(q);

            const float* r0 = img0.row(0);
            const float* r1 = img0.row(1);
            const float* r2 = img0.row(2);

            __m256 _k00 = _mm256_loadu_ps(k0);
            __m256 _k01 = _mm256_loadu_ps(k0 + 8);
            __m256 _k02 = _mm256_loadu_ps(k0 + 16);
            __m256 _k10 = _mm256_loadu_ps(k0 + 24);
            __m256 _k11 = _mm256_loadu_ps(k0 + 32);
            __m256 _k12 = _mm256_loadu_ps(k0 + 40);
            __m256 _k20 = _mm256_loadu_ps(k0 + 48);
            __m256 _k21 = _mm256_loadu_ps(k0 + 56);
            __m256 _k22 = _mm256_loadu_ps(k0 + 64);

            int i = 0;

            for (; i < outh; i++)
            {
                int j = 0;
                for (; j + 3 < outw; j += 4)
                {
                    __m256 _sum0 = _mm256_loadu_ps(outptr0);

                    __m256 _r01 = _mm256_broadcast_ss(r0);
                    __m256 _r02 = _mm256_broadcast_ss(r0 + 1);
                    __m256 _r03 = _mm256_broadcast_ss(r0 + 2);
                    __m256 _r11 = _mm256_broadcast_ss(r1);
                    __m256 _r12 = _mm256_broadcast_ss(r1 + 1);
                    __m256 _r13 = _mm256_broadcast_ss(r1 + 2);
                    __m256 _r21 = _mm256_broadcast_ss(r2);
                    __m256 _r22 = _mm256_broadcast_ss(r2 + 1);
                    __m256 _r23 = _mm256_broadcast_ss(r2 + 2);

                    _sum0 = _mm256_comp_fmadd_ps(_r01, _k00, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_r02, _k01, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_r03, _k02, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_r11, _k10, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_r12, _k11, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_r13, _k12, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_r21, _k20, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_r22, _k21, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_r23, _k22, _sum0);

                    __m256 _sum1 = _mm256_loadu_ps(outptr0 + 8);
                    __m256 _r04 = _mm256_broadcast_ss(r0 + 3);
                    __m256 _r14 = _mm256_broadcast_ss(r1 + 3);
                    __m256 _r24 = _mm256_broadcast_ss(r2 + 3);
                    _mm256_storeu_ps(outptr0, _sum0);

                    _sum1 = _mm256_comp_fmadd_ps(_r02, _k00, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_r03, _k01, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_r04, _k02, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_r12, _k10, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_r13, _k11, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_r14, _k12, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_r22, _k20, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_r23, _k21, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_r24, _k22, _sum1);

                    __m256 _sum2 = _mm256_loadu_ps(outptr0 + 16);
                    __m256 _r05 = _mm256_broadcast_ss(r0 + 4);
                    __m256 _r15 = _mm256_broadcast_ss(r1 + 4);
                    __m256 _r25 = _mm256_broadcast_ss(r2 + 4);
                    _mm256_storeu_ps(outptr0 + 8, _sum1);

                    _sum2 = _mm256_comp_fmadd_ps(_r03, _k00, _sum2);
                    _sum2 = _mm256_comp_fmadd_ps(_r04, _k01, _sum2);
                    _sum2 = _mm256_comp_fmadd_ps(_r05, _k02, _sum2);
                    _sum2 = _mm256_comp_fmadd_ps(_r13, _k10, _sum2);
                    _sum2 = _mm256_comp_fmadd_ps(_r14, _k11, _sum2);
                    _sum2 = _mm256_comp_fmadd_ps(_r15, _k12, _sum2);
                    _sum2 = _mm256_comp_fmadd_ps(_r23, _k20, _sum2);
                    _sum2 = _mm256_comp_fmadd_ps(_r24, _k21, _sum2);
                    _sum2 = _mm256_comp_fmadd_ps(_r25, _k22, _sum2);

                    __m256 _sum3 = _mm256_loadu_ps(outptr0 + 24);
                    __m256 _r06 = _mm256_broadcast_ss(r0 + 5);
                    __m256 _r16 = _mm256_broadcast_ss(r1 + 5);
                    __m256 _r26 = _mm256_broadcast_ss(r2 + 5);
                    _mm256_storeu_ps(outptr0 + 16, _sum2);

                    _sum3 = _mm256_comp_fmadd_ps(_r04, _k00, _sum3);
                    _sum3 = _mm256_comp_fmadd_ps(_r05, _k01, _sum3);
                    _sum3 = _mm256_comp_fmadd_ps(_r06, _k02, _sum3);
                    _sum3 = _mm256_comp_fmadd_ps(_r14, _k10, _sum3);
                    _sum3 = _mm256_comp_fmadd_ps(_r15, _k11, _sum3);
                    _sum3 = _mm256_comp_fmadd_ps(_r16, _k12, _sum3);
                    _sum3 = _mm256_comp_fmadd_ps(_r24, _k20, _sum3);
                    _sum3 = _mm256_comp_fmadd_ps(_r25, _k21, _sum3);
                    _sum3 = _mm256_comp_fmadd_ps(_r26, _k22, _sum3);

                    _mm256_storeu_ps(outptr0 + 24, _sum3);

                    r0 += 4;
                    r1 += 4;
                    r2 += 4;
                    outptr0 += 32;
                }
                for (; j + 1 < outw; j += 2)
                {
                    __m256 _sum0 = _mm256_loadu_ps(outptr0);

                    __m256 _r01 = _mm256_broadcast_ss(r0);
                    __m256 _r02 = _mm256_broadcast_ss(r0 + 1);
                    __m256 _r03 = _mm256_broadcast_ss(r0 + 2);
                    __m256 _r11 = _mm256_broadcast_ss(r1);
                    __m256 _r12 = _mm256_broadcast_ss(r1 + 1);
                    __m256 _r13 = _mm256_broadcast_ss(r1 + 2);
                    __m256 _r21 = _mm256_broadcast_ss(r2);
                    __m256 _r22 = _mm256_broadcast_ss(r2 + 1);
                    __m256 _r23 = _mm256_broadcast_ss(r2 + 2);

                    _sum0 = _mm256_comp_fmadd_ps(_r01, _k00, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_r02, _k01, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_r03, _k02, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_r11, _k10, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_r12, _k11, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_r13, _k12, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_r21, _k20, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_r22, _k21, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_r23, _k22, _sum0);

                    __m256 _sum1 = _mm256_loadu_ps(outptr0 + 8);
                    __m256 _r04 = _mm256_broadcast_ss(r0 + 3);
                    __m256 _r14 = _mm256_broadcast_ss(r1 + 3);
                    __m256 _r24 = _mm256_broadcast_ss(r2 + 3);
                    _mm256_storeu_ps(outptr0, _sum0);

                    _sum1 = _mm256_comp_fmadd_ps(_r02, _k00, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_r03, _k01, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_r04, _k02, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_r12, _k10, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_r13, _k11, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_r14, _k12, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_r22, _k20, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_r23, _k21, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_r24, _k22, _sum1);

                    _mm256_storeu_ps(outptr0 + 8, _sum1);

                    r0 += 2;
                    r1 += 2;
                    r2 += 2;
                    outptr0 += 16;
                }
                for (; j < outw; j++)
                {
                    __m256 _sum0 = _mm256_loadu_ps(outptr0);

                    __m256 _r01 = _mm256_broadcast_ss(r0);
                    __m256 _r02 = _mm256_broadcast_ss(r0 + 1);
                    __m256 _r03 = _mm256_broadcast_ss(r0 + 2);
                    __m256 _r11 = _mm256_broadcast_ss(r1);
                    __m256 _r12 = _mm256_broadcast_ss(r1 + 1);
                    __m256 _r13 = _mm256_broadcast_ss(r1 + 2);
                    __m256 _r21 = _mm256_broadcast_ss(r2);
                    __m256 _r22 = _mm256_broadcast_ss(r2 + 1);
                    __m256 _r23 = _mm256_broadcast_ss(r2 + 2);

                    _sum0 = _mm256_comp_fmadd_ps(_r01, _k00, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_r02, _k01, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_r03, _k02, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_r11, _k10, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_r12, _k11, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_r13, _k12, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_r21, _k20, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_r22, _k21, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_r23, _k22, _sum0);

                    _mm256_storeu_ps(outptr0, _sum0);
                    r0 += 1;
                    r1 += 1;
                    r2 += 1;
                    outptr0 += 8;
                }

                r0 += 2;
                r1 += 2;
                r2 += 2;
            }

            k0 += 9 * 8;
        }
    }
}